

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx2::CurveNiIntersectorK<4,4>::
     occluded_t<embree::avx2::SweepCurve1IntersectorK<embree::BezierCurveT,4>,embree::avx2::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  Primitive PVar1;
  Geometry *pGVar2;
  RTCFilterFunctionN p_Var3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  int iVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  ulong uVar50;
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  uint uVar57;
  uint uVar58;
  ulong uVar59;
  long lVar60;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  ulong extraout_RAX_05;
  ulong extraout_RAX_06;
  uint uVar61;
  byte bVar62;
  ulong uVar63;
  undefined4 uVar64;
  undefined8 in_R11;
  ulong uVar65;
  bool bVar66;
  byte bVar67;
  float fVar68;
  undefined8 uVar69;
  float fVar95;
  vint4 bi_2;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar70 [16];
  float fVar94;
  float fVar96;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar74 [16];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  float fVar97;
  float fVar126;
  float fVar127;
  vint4 bi_1;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar107 [16];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar114 [16];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  float fVar150;
  float fVar151;
  float fVar152;
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  vint4 ai_2;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  float fVar171;
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar163 [16];
  undefined1 auVar170 [32];
  vint4 ai;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar172 [16];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  vint4 bi;
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [28];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  float fVar197;
  float fVar206;
  float fVar207;
  vint4 ai_1;
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  float fVar209;
  float fVar210;
  float fVar211;
  undefined1 auVar202 [32];
  float fVar208;
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar212 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar213 [16];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [64];
  undefined1 auVar226 [16];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar240 [32];
  undefined1 auVar257 [32];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [64];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  float fVar239;
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  float fVar244;
  float fVar245;
  float fVar246;
  undefined1 auVar243 [64];
  float fVar251;
  undefined1 auVar247 [16];
  float fVar252;
  undefined1 auVar249 [32];
  undefined1 auVar248 [16];
  float fVar253;
  float fVar254;
  float fVar255;
  undefined1 auVar250 [64];
  undefined1 auVar256 [16];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  float fVar262;
  undefined1 auVar260 [64];
  undefined1 auVar261 [64];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [16];
  undefined1 auVar270 [32];
  undefined1 auVar271 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  int local_c04;
  undefined1 local_c00 [8];
  float fStack_bf8;
  float fStack_bf4;
  float fStack_bf0;
  float fStack_bec;
  float fStack_be8;
  float fStack_adc;
  float fStack_ad8;
  float fStack_ad4;
  float local_aa0;
  float fStack_a9c;
  float fStack_a98;
  float fStack_a94;
  RTCFilterFunctionNArguments local_a50;
  undefined1 local_a20 [8];
  float fStack_a18;
  float fStack_a14;
  float fStack_a10;
  float fStack_a0c;
  float fStack_a08;
  float fStack_a04;
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [16];
  undefined1 local_950 [16];
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [16];
  undefined1 local_8b0 [16];
  Primitive *local_898;
  ulong local_890;
  ulong local_888;
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  undefined1 local_860 [32];
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  undefined1 local_800 [32];
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  undefined4 uStack_7c4;
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  uint local_720;
  uint uStack_71c;
  uint uStack_718;
  uint uStack_714;
  uint local_710;
  uint uStack_70c;
  uint uStack_708;
  uint uStack_704;
  RTCHitN local_700 [16];
  undefined1 auStack_6f0 [16];
  undefined4 local_6e0;
  undefined4 uStack_6dc;
  undefined4 uStack_6d8;
  undefined4 uStack_6d4;
  undefined1 local_6d0 [16];
  undefined1 local_6c0 [16];
  undefined8 local_6b0;
  undefined8 uStack_6a8;
  undefined1 local_6a0 [16];
  uint local_690;
  uint uStack_68c;
  uint uStack_688;
  uint uStack_684;
  uint uStack_680;
  uint uStack_67c;
  uint uStack_678;
  uint uStack_674;
  undefined4 local_660;
  undefined4 uStack_65c;
  undefined4 uStack_658;
  undefined4 uStack_654;
  undefined4 uStack_650;
  undefined4 uStack_64c;
  undefined4 uStack_648;
  undefined4 uStack_644;
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [16];
  undefined1 local_590 [16];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  float local_500;
  float fStack_4fc;
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  float local_4e0;
  float fStack_4dc;
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  undefined4 uStack_3f0;
  undefined4 uStack_3ec;
  undefined4 uStack_3e8;
  undefined4 uStack_3e4;
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  undefined4 uStack_3d0;
  undefined4 uStack_3cc;
  undefined4 uStack_3c8;
  undefined4 uStack_3c4;
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  float local_280;
  float fStack_27c;
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  undefined1 local_260 [32];
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  int aiStack_138 [66];
  
  PVar1 = prim[1];
  uVar59 = (ulong)(byte)PVar1;
  auVar4 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x10
                        );
  auVar4 = vinsertps_avx(auVar4,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar5 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                         ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar5 = vinsertps_avx(auVar5,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar68 = *(float *)(prim + uVar59 * 0x19 + 0x12);
  auVar4 = vsubps_avx(auVar4,*(undefined1 (*) [16])(prim + uVar59 * 0x19 + 6));
  auVar70._0_4_ = fVar68 * auVar4._0_4_;
  auVar70._4_4_ = fVar68 * auVar4._4_4_;
  auVar70._8_4_ = fVar68 * auVar4._8_4_;
  auVar70._12_4_ = fVar68 * auVar4._12_4_;
  auVar134._0_4_ = fVar68 * auVar5._0_4_;
  auVar134._4_4_ = fVar68 * auVar5._4_4_;
  auVar134._8_4_ = fVar68 * auVar5._8_4_;
  auVar134._12_4_ = fVar68 * auVar5._12_4_;
  auVar4 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 4 + 6)));
  auVar4 = vcvtdq2ps_avx(auVar4);
  auVar5 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 5 + 6)));
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar6 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 6 + 6)));
  auVar6 = vcvtdq2ps_avx(auVar6);
  auVar7 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 0xb + 6)));
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar79 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 0xc + 6)));
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar8 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 0xd + 6)));
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar73 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 0x12 + 6)));
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar72 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 0x13 + 6)));
  auVar72 = vcvtdq2ps_avx(auVar72);
  auVar132 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 0x14 + 6)));
  auVar132 = vcvtdq2ps_avx(auVar132);
  auVar263._4_4_ = auVar134._0_4_;
  auVar263._0_4_ = auVar134._0_4_;
  auVar263._8_4_ = auVar134._0_4_;
  auVar263._12_4_ = auVar134._0_4_;
  auVar99 = vshufps_avx(auVar134,auVar134,0x55);
  auVar71 = vshufps_avx(auVar134,auVar134,0xaa);
  fVar68 = auVar71._0_4_;
  auVar234._0_4_ = fVar68 * auVar6._0_4_;
  fVar94 = auVar71._4_4_;
  auVar234._4_4_ = fVar94 * auVar6._4_4_;
  fVar95 = auVar71._8_4_;
  auVar234._8_4_ = fVar95 * auVar6._8_4_;
  fVar96 = auVar71._12_4_;
  auVar234._12_4_ = fVar96 * auVar6._12_4_;
  auVar229._0_4_ = auVar8._0_4_ * fVar68;
  auVar229._4_4_ = auVar8._4_4_ * fVar94;
  auVar229._8_4_ = auVar8._8_4_ * fVar95;
  auVar229._12_4_ = auVar8._12_4_ * fVar96;
  auVar212._0_4_ = auVar132._0_4_ * fVar68;
  auVar212._4_4_ = auVar132._4_4_ * fVar94;
  auVar212._8_4_ = auVar132._8_4_ * fVar95;
  auVar212._12_4_ = auVar132._12_4_ * fVar96;
  auVar71 = vfmadd231ps_fma(auVar234,auVar99,auVar5);
  auVar100 = vfmadd231ps_fma(auVar229,auVar99,auVar79);
  auVar99 = vfmadd231ps_fma(auVar212,auVar72,auVar99);
  auVar153 = vfmadd231ps_fma(auVar71,auVar263,auVar4);
  auVar100 = vfmadd231ps_fma(auVar100,auVar263,auVar7);
  auVar76 = vfmadd231ps_fma(auVar99,auVar73,auVar263);
  auVar264._4_4_ = auVar70._0_4_;
  auVar264._0_4_ = auVar70._0_4_;
  auVar264._8_4_ = auVar70._0_4_;
  auVar264._12_4_ = auVar70._0_4_;
  auVar99 = vshufps_avx(auVar70,auVar70,0x55);
  auVar71 = vshufps_avx(auVar70,auVar70,0xaa);
  fVar68 = auVar71._0_4_;
  auVar184._0_4_ = fVar68 * auVar6._0_4_;
  fVar94 = auVar71._4_4_;
  auVar184._4_4_ = fVar94 * auVar6._4_4_;
  fVar95 = auVar71._8_4_;
  auVar184._8_4_ = fVar95 * auVar6._8_4_;
  fVar96 = auVar71._12_4_;
  auVar184._12_4_ = fVar96 * auVar6._12_4_;
  auVar98._0_4_ = auVar8._0_4_ * fVar68;
  auVar98._4_4_ = auVar8._4_4_ * fVar94;
  auVar98._8_4_ = auVar8._8_4_ * fVar95;
  auVar98._12_4_ = auVar8._12_4_ * fVar96;
  auVar71._0_4_ = auVar132._0_4_ * fVar68;
  auVar71._4_4_ = auVar132._4_4_ * fVar94;
  auVar71._8_4_ = auVar132._8_4_ * fVar95;
  auVar71._12_4_ = auVar132._12_4_ * fVar96;
  auVar5 = vfmadd231ps_fma(auVar184,auVar99,auVar5);
  auVar6 = vfmadd231ps_fma(auVar98,auVar99,auVar79);
  auVar79 = vfmadd231ps_fma(auVar71,auVar99,auVar72);
  auVar8 = vfmadd231ps_fma(auVar5,auVar264,auVar4);
  auVar72 = vfmadd231ps_fma(auVar6,auVar264,auVar7);
  auVar132 = vfmadd231ps_fma(auVar79,auVar264,auVar73);
  auVar226._8_4_ = 0x7fffffff;
  auVar226._0_8_ = 0x7fffffff7fffffff;
  auVar226._12_4_ = 0x7fffffff;
  auVar4 = vandps_avx(auVar153,auVar226);
  auVar172._8_4_ = 0x219392ef;
  auVar172._0_8_ = 0x219392ef219392ef;
  auVar172._12_4_ = 0x219392ef;
  auVar4 = vcmpps_avx(auVar4,auVar172,1);
  auVar5 = vblendvps_avx(auVar153,auVar172,auVar4);
  auVar4 = vandps_avx(auVar100,auVar226);
  auVar4 = vcmpps_avx(auVar4,auVar172,1);
  auVar6 = vblendvps_avx(auVar100,auVar172,auVar4);
  auVar4 = vandps_avx(auVar226,auVar76);
  auVar4 = vcmpps_avx(auVar4,auVar172,1);
  auVar4 = vblendvps_avx(auVar76,auVar172,auVar4);
  auVar7 = vrcpps_avx(auVar5);
  auVar213._8_4_ = 0x3f800000;
  auVar213._0_8_ = 0x3f8000003f800000;
  auVar213._12_4_ = 0x3f800000;
  auVar5 = vfnmadd213ps_fma(auVar5,auVar7,auVar213);
  auVar7 = vfmadd132ps_fma(auVar5,auVar7,auVar7);
  auVar5 = vrcpps_avx(auVar6);
  auVar6 = vfnmadd213ps_fma(auVar6,auVar5,auVar213);
  auVar79 = vfmadd132ps_fma(auVar6,auVar5,auVar5);
  auVar5 = vrcpps_avx(auVar4);
  auVar4 = vfnmadd213ps_fma(auVar4,auVar5,auVar213);
  auVar73 = vfmadd132ps_fma(auVar4,auVar5,auVar5);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + uVar59 * 7 + 6);
  auVar4 = vpmovsxwd_avx(auVar4);
  auVar4 = vcvtdq2ps_avx(auVar4);
  auVar4 = vsubps_avx(auVar4,auVar8);
  auVar76._0_4_ = auVar7._0_4_ * auVar4._0_4_;
  auVar76._4_4_ = auVar7._4_4_ * auVar4._4_4_;
  auVar76._8_4_ = auVar7._8_4_ * auVar4._8_4_;
  auVar76._12_4_ = auVar7._12_4_ * auVar4._12_4_;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar59 * 9 + 6);
  auVar4 = vpmovsxwd_avx(auVar5);
  auVar4 = vcvtdq2ps_avx(auVar4);
  auVar4 = vsubps_avx(auVar4,auVar8);
  auVar185._0_4_ = auVar7._0_4_ * auVar4._0_4_;
  auVar185._4_4_ = auVar7._4_4_ * auVar4._4_4_;
  auVar185._8_4_ = auVar7._8_4_ * auVar4._8_4_;
  auVar185._12_4_ = auVar7._12_4_ * auVar4._12_4_;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar59 * 0xe + 6);
  auVar4 = vpmovsxwd_avx(auVar6);
  auVar4 = vcvtdq2ps_avx(auVar4);
  auVar4 = vsubps_avx(auVar4,auVar72);
  auVar198._0_4_ = auVar79._0_4_ * auVar4._0_4_;
  auVar198._4_4_ = auVar79._4_4_ * auVar4._4_4_;
  auVar198._8_4_ = auVar79._8_4_ * auVar4._8_4_;
  auVar198._12_4_ = auVar79._12_4_ * auVar4._12_4_;
  auVar100._1_3_ = 0;
  auVar100[0] = PVar1;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar1 * 0x10 + 6);
  auVar4 = vpmovsxwd_avx(auVar7);
  auVar4 = vcvtdq2ps_avx(auVar4);
  auVar4 = vsubps_avx(auVar4,auVar72);
  auVar99._0_4_ = auVar79._0_4_ * auVar4._0_4_;
  auVar99._4_4_ = auVar79._4_4_ * auVar4._4_4_;
  auVar99._8_4_ = auVar79._8_4_ * auVar4._8_4_;
  auVar99._12_4_ = auVar79._12_4_ * auVar4._12_4_;
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + uVar59 * 0x15 + 6);
  auVar4 = vpmovsxwd_avx(auVar79);
  auVar4 = vcvtdq2ps_avx(auVar4);
  auVar4 = vsubps_avx(auVar4,auVar132);
  auVar153._0_4_ = auVar73._0_4_ * auVar4._0_4_;
  auVar153._4_4_ = auVar73._4_4_ * auVar4._4_4_;
  auVar153._8_4_ = auVar73._8_4_ * auVar4._8_4_;
  auVar153._12_4_ = auVar73._12_4_ * auVar4._12_4_;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar59 * 0x17 + 6);
  auVar4 = vpmovsxwd_avx(auVar8);
  auVar4 = vcvtdq2ps_avx(auVar4);
  auVar4 = vsubps_avx(auVar4,auVar132);
  auVar72._0_4_ = auVar73._0_4_ * auVar4._0_4_;
  auVar72._4_4_ = auVar73._4_4_ * auVar4._4_4_;
  auVar72._8_4_ = auVar73._8_4_ * auVar4._8_4_;
  auVar72._12_4_ = auVar73._12_4_ * auVar4._12_4_;
  auVar4 = vpminsd_avx(auVar76,auVar185);
  auVar5 = vpminsd_avx(auVar198,auVar99);
  auVar4 = vmaxps_avx(auVar4,auVar5);
  auVar5 = vpminsd_avx(auVar153,auVar72);
  uVar64 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar230._4_4_ = uVar64;
  auVar230._0_4_ = uVar64;
  auVar230._8_4_ = uVar64;
  auVar230._12_4_ = uVar64;
  auVar5 = vmaxps_avx(auVar5,auVar230);
  auVar4 = vmaxps_avx(auVar4,auVar5);
  local_5a0._0_4_ = auVar4._0_4_ * 0.99999964;
  local_5a0._4_4_ = auVar4._4_4_ * 0.99999964;
  local_5a0._8_4_ = auVar4._8_4_ * 0.99999964;
  local_5a0._12_4_ = auVar4._12_4_ * 0.99999964;
  auVar4 = vpmaxsd_avx(auVar76,auVar185);
  auVar5 = vpmaxsd_avx(auVar198,auVar99);
  auVar4 = vminps_avx(auVar4,auVar5);
  auVar5 = vpmaxsd_avx(auVar153,auVar72);
  uVar64 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar132._4_4_ = uVar64;
  auVar132._0_4_ = uVar64;
  auVar132._8_4_ = uVar64;
  auVar132._12_4_ = uVar64;
  auVar5 = vminps_avx(auVar5,auVar132);
  auVar4 = vminps_avx(auVar4,auVar5);
  auVar73._0_4_ = auVar4._0_4_ * 1.0000004;
  auVar73._4_4_ = auVar4._4_4_ * 1.0000004;
  auVar73._8_4_ = auVar4._8_4_ * 1.0000004;
  auVar73._12_4_ = auVar4._12_4_ * 1.0000004;
  auVar100[4] = PVar1;
  auVar100._5_3_ = 0;
  auVar100[8] = PVar1;
  auVar100._9_3_ = 0;
  auVar100[0xc] = PVar1;
  auVar100._13_3_ = 0;
  auVar5 = vpcmpgtd_avx(auVar100,_DAT_01f4ad30);
  auVar4 = vcmpps_avx(local_5a0,auVar73,2);
  auVar4 = vandps_avx(auVar4,auVar5);
  uVar64 = vmovmskps_avx(auVar4);
  local_888 = CONCAT44((int)((ulong)in_R11 >> 0x20),uVar64);
  auVar84._16_16_ = mm_lookupmask_ps._240_16_;
  auVar84._0_16_ = mm_lookupmask_ps._240_16_;
  local_520 = vblendps_avx(auVar84,ZEXT832(0) << 0x20,0x80);
  local_898 = prim;
LAB_0119509d:
  if (local_888 == 0) {
LAB_01197756:
    return local_888 != 0;
  }
  lVar60 = 0;
  for (uVar59 = local_888; (uVar59 & 1) == 0; uVar59 = uVar59 >> 1 | 0x8000000000000000) {
    lVar60 = lVar60 + 1;
  }
  uVar58 = *(uint *)(local_898 + 2);
  local_720 = *(uint *)(local_898 + lVar60 * 4 + 6);
  pGVar2 = (context->scene->geometries).items[uVar58].ptr;
  uVar59 = (ulong)*(uint *)(*(long *)&pGVar2->field_0x58 +
                           pGVar2[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)local_720);
  p_Var3 = pGVar2[1].intersectionFilterN;
  lVar60 = *(long *)&pGVar2[1].time_range.upper;
  auVar4 = *(undefined1 (*) [16])(lVar60 + (long)p_Var3 * uVar59);
  auVar5 = *(undefined1 (*) [16])(lVar60 + (uVar59 + 1) * (long)p_Var3);
  auVar6 = *(undefined1 (*) [16])(lVar60 + (uVar59 + 2) * (long)p_Var3);
  local_890 = local_888 - 1 & local_888;
  auVar7 = *(undefined1 (*) [16])(lVar60 + (uVar59 + 3) * (long)p_Var3);
  if (local_890 != 0) {
    uVar63 = local_890 - 1 & local_890;
    for (uVar59 = local_890; (uVar59 & 1) == 0; uVar59 = uVar59 >> 1 | 0x8000000000000000) {
    }
    if (uVar63 != 0) {
      for (; (uVar63 & 1) == 0; uVar63 = uVar63 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar79 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar8 = vinsertps_avx(auVar79,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  uVar64 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar247._4_4_ = uVar64;
  auVar247._0_4_ = uVar64;
  auVar247._8_4_ = uVar64;
  auVar247._12_4_ = uVar64;
  fStack_630 = (float)uVar64;
  _local_640 = auVar247;
  fStack_62c = (float)uVar64;
  fStack_628 = (float)uVar64;
  register0x0000151c = uVar64;
  uVar64 = *(undefined4 *)(ray + k * 4 + 0x50);
  auVar256._4_4_ = uVar64;
  auVar256._0_4_ = uVar64;
  auVar256._8_4_ = uVar64;
  auVar256._12_4_ = uVar64;
  fStack_7b0 = (float)uVar64;
  _local_7c0 = auVar256;
  fStack_7ac = (float)uVar64;
  fStack_7a8 = (float)uVar64;
  register0x0000155c = uVar64;
  auVar79 = vunpcklps_avx(auVar247,auVar256);
  fVar68 = *(float *)(ray + k * 4 + 0x60);
  auVar269._4_4_ = fVar68;
  auVar269._0_4_ = fVar68;
  auVar269._8_4_ = fVar68;
  auVar269._12_4_ = fVar68;
  fStack_7d0 = fVar68;
  _local_7e0 = auVar269;
  fStack_7cc = fVar68;
  fStack_7c8 = fVar68;
  uStack_7c4 = fVar68;
  local_950 = vinsertps_avx(auVar79,auVar269,0x28);
  auVar186._0_4_ = (auVar6._0_4_ + auVar4._0_4_ + auVar5._0_4_ + auVar7._0_4_) * 0.25;
  auVar186._4_4_ = (auVar6._4_4_ + auVar4._4_4_ + auVar5._4_4_ + auVar7._4_4_) * 0.25;
  auVar186._8_4_ = (auVar6._8_4_ + auVar4._8_4_ + auVar5._8_4_ + auVar7._8_4_) * 0.25;
  auVar186._12_4_ = (auVar6._12_4_ + auVar4._12_4_ + auVar5._12_4_ + auVar7._12_4_) * 0.25;
  auVar79 = vsubps_avx(auVar186,auVar8);
  auVar79 = vdpps_avx(auVar79,local_950,0x7f);
  local_960 = vdpps_avx(local_950,local_950,0x7f);
  auVar233 = ZEXT1664(local_960);
  auVar73 = vrcpss_avx(local_960,local_960);
  auVar72 = vfnmadd213ss_fma(auVar73,local_960,ZEXT416(0x40000000));
  local_3c0 = auVar79._0_4_ * auVar73._0_4_ * auVar72._0_4_;
  auVar199._4_4_ = local_3c0;
  auVar199._0_4_ = local_3c0;
  auVar199._8_4_ = local_3c0;
  auVar199._12_4_ = local_3c0;
  fStack_870 = local_3c0;
  _local_880 = auVar199;
  fStack_86c = local_3c0;
  fStack_868 = local_3c0;
  fStack_864 = local_3c0;
  auVar79 = vfmadd231ps_fma(auVar8,local_950,auVar199);
  auVar79 = vblendps_avx(auVar79,_DAT_01f45a50,8);
  auVar8 = vsubps_avx(auVar4,auVar79);
  auVar73 = vsubps_avx(auVar6,auVar79);
  auVar225 = ZEXT1664(auVar73);
  auVar72 = vsubps_avx(auVar5,auVar79);
  auVar7 = vsubps_avx(auVar7,auVar79);
  auVar4 = vmovshdup_avx(auVar8);
  uVar69 = auVar4._0_8_;
  auVar179._8_8_ = uVar69;
  auVar179._0_8_ = uVar69;
  auVar179._16_8_ = uVar69;
  auVar179._24_8_ = uVar69;
  auVar4 = vshufps_avx(auVar8,auVar8,0xaa);
  uVar69 = auVar4._0_8_;
  auVar202._8_8_ = uVar69;
  auVar202._0_8_ = uVar69;
  auVar202._16_8_ = uVar69;
  auVar202._24_8_ = uVar69;
  auVar4 = vshufps_avx(auVar8,auVar8,0xff);
  uVar69 = auVar4._0_8_;
  local_380._8_8_ = uVar69;
  local_380._0_8_ = uVar69;
  local_380._16_8_ = uVar69;
  local_380._24_8_ = uVar69;
  auVar4 = vmovshdup_avx(auVar72);
  local_940 = auVar4._0_8_;
  auVar4 = vshufps_avx(auVar72,auVar72,0xaa);
  uVar69 = auVar4._0_8_;
  local_900._8_8_ = uVar69;
  local_900._0_8_ = uVar69;
  local_900._16_8_ = uVar69;
  local_900._24_8_ = uVar69;
  auVar243 = ZEXT3264(local_900);
  auVar5 = vshufps_avx(auVar72,auVar72,0xff);
  uVar69 = auVar5._0_8_;
  auVar265._8_8_ = uVar69;
  auVar265._0_8_ = uVar69;
  auVar265._16_8_ = uVar69;
  auVar265._24_8_ = uVar69;
  auVar4 = vmovshdup_avx(auVar73);
  local_4e0 = auVar4._0_4_;
  fStack_4dc = auVar4._4_4_;
  auVar4 = vshufps_avx(auVar73,auVar73,0xaa);
  local_1e0 = auVar4._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar4 = vshufps_avx(auVar73,auVar73,0xff);
  local_500 = auVar4._0_4_;
  fStack_4fc = auVar4._4_4_;
  auVar4 = vmovshdup_avx(auVar7);
  local_200 = auVar4._0_8_;
  uStack_1f8 = local_200;
  uStack_1f0 = local_200;
  uStack_1e8 = local_200;
  auVar4 = vshufps_avx(auVar7,auVar7,0xaa);
  local_220 = auVar4._0_8_;
  uStack_218 = local_220;
  uStack_210 = local_220;
  uStack_208 = local_220;
  auVar4 = vshufps_avx(auVar7,auVar7,0xff);
  local_240 = auVar4._0_8_;
  uStack_238 = local_240;
  uStack_230 = local_240;
  uStack_228 = local_240;
  auVar4 = vfmadd231ps_fma(ZEXT432((uint)(fVar68 * fVar68)),_local_7c0,_local_7c0);
  auVar4 = vfmadd231ps_fma(ZEXT1632(auVar4),_local_640,_local_640);
  uVar64 = auVar4._0_4_;
  local_260._4_4_ = uVar64;
  local_260._0_4_ = uVar64;
  local_260._8_4_ = uVar64;
  local_260._12_4_ = uVar64;
  local_260._16_4_ = uVar64;
  local_260._20_4_ = uVar64;
  local_260._24_4_ = uVar64;
  local_260._28_4_ = uVar64;
  fVar68 = *(float *)(ray + k * 4 + 0x30);
  local_8c0 = ZEXT416((uint)local_3c0);
  local_3c0 = fVar68 - local_3c0;
  fStack_3bc = local_3c0;
  fStack_3b8 = local_3c0;
  fStack_3b4 = local_3c0;
  fStack_3b0 = local_3c0;
  fStack_3ac = local_3c0;
  fStack_3a8 = local_3c0;
  fStack_3a4 = local_3c0;
  uVar59 = 0;
  bVar62 = 0;
  local_c04 = 1;
  uVar64 = auVar8._0_4_;
  local_3a0._4_4_ = uVar64;
  local_3a0._0_4_ = uVar64;
  local_3a0._8_4_ = uVar64;
  local_3a0._12_4_ = uVar64;
  local_3a0._16_4_ = uVar64;
  local_3a0._20_4_ = uVar64;
  local_3a0._24_4_ = uVar64;
  local_3a0._28_4_ = uVar64;
  fVar94 = auVar72._0_4_;
  auVar236._4_4_ = fVar94;
  auVar236._0_4_ = fVar94;
  auVar236._8_4_ = fVar94;
  auVar236._12_4_ = fVar94;
  auVar236._16_4_ = fVar94;
  auVar236._20_4_ = fVar94;
  auVar236._24_4_ = fVar94;
  auVar236._28_4_ = fVar94;
  fVar96 = auVar73._0_4_;
  local_280 = fVar96;
  fStack_27c = fVar96;
  fStack_278 = fVar96;
  fStack_274 = fVar96;
  fStack_270 = fVar96;
  fStack_26c = fVar96;
  fStack_268 = fVar96;
  fStack_264 = fVar96;
  fVar95 = auVar7._0_4_;
  local_2a0 = fVar95;
  fStack_29c = fVar95;
  fStack_298 = fVar95;
  fStack_294 = fVar95;
  fStack_290 = fVar95;
  fStack_28c = fVar95;
  fStack_288 = fVar95;
  fStack_284 = fVar95;
  local_800._8_4_ = 0x7fffffff;
  local_800._0_8_ = 0x7fffffff7fffffff;
  local_800._12_4_ = 0x7fffffff;
  local_800._16_4_ = 0x7fffffff;
  local_800._20_4_ = 0x7fffffff;
  local_800._24_4_ = 0x7fffffff;
  local_800._28_4_ = 0x7fffffff;
  local_580 = vandps_avx(local_260,local_800);
  auVar4 = vsqrtss_avx(local_960,local_960);
  auVar6 = vsqrtss_avx(local_960,local_960);
  auVar260 = ZEXT3264(local_900);
  auVar250 = ZEXT3264(CONCAT824(local_940,CONCAT816(local_940,CONCAT88(local_940,local_940))));
  local_590 = ZEXT816(0x3f80000000000000);
  local_9a0 = auVar236;
  uStack_938 = local_940;
  uStack_930 = local_940;
  uStack_928 = local_940;
  uStack_71c = local_720;
  uStack_718 = local_720;
  uStack_714 = local_720;
  local_710 = uVar58;
  uStack_70c = uVar58;
  uStack_708 = uVar58;
  uStack_704 = uVar58;
  local_560 = auVar202;
  local_540 = auVar179;
  fStack_4f8 = local_500;
  fStack_4f4 = fStack_4fc;
  fStack_4f0 = local_500;
  fStack_4ec = fStack_4fc;
  fStack_4e8 = local_500;
  fStack_4e4 = fStack_4fc;
  fStack_4d8 = local_4e0;
  fStack_4d4 = fStack_4dc;
  fStack_4d0 = local_4e0;
  fStack_4cc = fStack_4dc;
  fStack_4c8 = local_4e0;
  fStack_4c4 = fStack_4dc;
  do {
    auVar180._8_4_ = 0x3f800000;
    auVar180._0_8_ = 0x3f8000003f800000;
    auVar180._12_4_ = 0x3f800000;
    auVar180._16_4_ = 0x3f800000;
    auVar180._20_4_ = 0x3f800000;
    auVar180._24_4_ = 0x3f800000;
    auVar180._28_4_ = 0x3f800000;
    auVar79 = vmovshdup_avx(local_590);
    auVar79 = vsubps_avx(auVar79,local_590);
    fVar129 = auVar79._0_4_;
    fVar131 = fVar129 * 0.04761905;
    local_760._0_4_ = local_590._0_4_;
    local_760._4_4_ = local_760._0_4_;
    local_760._8_4_ = local_760._0_4_;
    local_760._12_4_ = local_760._0_4_;
    local_760._16_4_ = local_760._0_4_;
    local_760._20_4_ = local_760._0_4_;
    local_760._24_4_ = local_760._0_4_;
    local_760._28_4_ = local_760._0_4_;
    local_780._4_4_ = fVar129;
    local_780._0_4_ = fVar129;
    local_780._8_4_ = fVar129;
    local_780._12_4_ = fVar129;
    local_780._16_4_ = fVar129;
    local_780._20_4_ = fVar129;
    local_780._24_4_ = fVar129;
    local_780._28_4_ = fVar129;
    auVar79 = vfmadd231ps_fma(local_760,local_780,_DAT_01f7b040);
    auVar84 = vsubps_avx(auVar180,ZEXT1632(auVar79));
    fVar97 = auVar79._0_4_;
    auVar271._0_4_ = auVar236._0_4_ * fVar97;
    fVar126 = auVar79._4_4_;
    auVar271._4_4_ = auVar236._4_4_ * fVar126;
    fVar127 = auVar79._8_4_;
    auVar271._8_4_ = auVar236._8_4_ * fVar127;
    fVar128 = auVar79._12_4_;
    auVar271._12_4_ = auVar236._12_4_ * fVar128;
    auVar271._16_4_ = auVar236._16_4_ * 0.0;
    auVar271._20_4_ = auVar236._20_4_ * 0.0;
    auVar271._28_36_ = auVar243._28_36_;
    auVar271._24_4_ = auVar236._24_4_ * 0.0;
    auVar243._0_4_ = auVar250._0_4_ * fVar97;
    auVar243._4_4_ = auVar250._4_4_ * fVar126;
    auVar243._8_4_ = auVar250._8_4_ * fVar127;
    auVar243._12_4_ = auVar250._12_4_ * fVar128;
    auVar243._16_4_ = auVar250._16_4_ * 0.0;
    auVar243._20_4_ = auVar250._20_4_ * 0.0;
    auVar243._28_36_ = auVar225._28_36_;
    auVar243._24_4_ = auVar250._24_4_ * 0.0;
    auVar225._0_4_ = auVar260._0_4_ * fVar97;
    auVar225._4_4_ = auVar260._4_4_ * fVar126;
    auVar225._8_4_ = auVar260._8_4_ * fVar127;
    auVar225._12_4_ = auVar260._12_4_ * fVar128;
    auVar225._16_4_ = auVar260._16_4_ * 0.0;
    auVar225._20_4_ = auVar260._20_4_ * 0.0;
    auVar225._28_36_ = auVar233._28_36_;
    auVar225._24_4_ = auVar260._24_4_ * 0.0;
    fVar130 = auVar5._0_4_;
    fVar197 = auVar5._4_4_;
    auVar10._4_4_ = fVar197 * fVar126;
    auVar10._0_4_ = fVar130 * fVar97;
    auVar10._8_4_ = fVar130 * fVar127;
    auVar10._12_4_ = fVar197 * fVar128;
    auVar10._16_4_ = fVar130 * 0.0;
    auVar10._20_4_ = fVar197 * 0.0;
    auVar10._24_4_ = fVar130 * 0.0;
    auVar10._28_4_ = fVar129;
    auVar79 = vfmadd231ps_fma(auVar271._0_32_,auVar84,local_3a0);
    auVar132 = vfmadd231ps_fma(auVar243._0_32_,auVar84,auVar179);
    auVar99 = vfmadd231ps_fma(auVar225._0_32_,auVar84,auVar202);
    auVar71 = vfmadd231ps_fma(auVar10,auVar84,local_380);
    auVar144._4_4_ = fStack_27c;
    auVar144._0_4_ = local_280;
    auVar144._8_4_ = fStack_278;
    auVar144._12_4_ = fStack_274;
    auVar144._16_4_ = fStack_270;
    auVar144._20_4_ = fStack_26c;
    auVar144._24_4_ = fStack_268;
    auVar144._28_4_ = fStack_264;
    auVar88._4_4_ = fStack_27c * fVar126;
    auVar88._0_4_ = local_280 * fVar97;
    auVar88._8_4_ = fStack_278 * fVar127;
    auVar88._12_4_ = fStack_274 * fVar128;
    auVar88._16_4_ = fStack_270 * 0.0;
    auVar88._20_4_ = fStack_26c * 0.0;
    auVar88._24_4_ = fStack_268 * 0.0;
    auVar88._28_4_ = local_380._28_4_;
    auVar11._4_4_ = fVar126 * fStack_4dc;
    auVar11._0_4_ = fVar97 * local_4e0;
    auVar11._8_4_ = fVar127 * fStack_4d8;
    auVar11._12_4_ = fVar128 * fStack_4d4;
    auVar11._16_4_ = fStack_4d0 * 0.0;
    auVar11._20_4_ = fStack_4cc * 0.0;
    auVar11._24_4_ = fStack_4c8 * 0.0;
    auVar11._28_4_ = local_3a0._28_4_;
    auVar54._8_8_ = uStack_1d8;
    auVar54._0_8_ = local_1e0;
    auVar54._16_8_ = uStack_1d0;
    auVar54._24_8_ = uStack_1c8;
    auVar182._4_4_ = (float)((ulong)local_1e0 >> 0x20) * fVar126;
    auVar182._0_4_ = (float)local_1e0 * fVar97;
    auVar182._8_4_ = (float)uStack_1d8 * fVar127;
    auVar182._12_4_ = (float)((ulong)uStack_1d8 >> 0x20) * fVar128;
    auVar182._16_4_ = (float)uStack_1d0 * 0.0;
    auVar182._20_4_ = (float)((ulong)uStack_1d0 >> 0x20) * 0.0;
    auVar182._24_4_ = (float)uStack_1c8 * 0.0;
    auVar182._28_4_ = 0x3f800000;
    auVar55._4_4_ = fVar126 * fStack_4fc;
    auVar55._0_4_ = fVar97 * local_500;
    auVar55._8_4_ = fVar127 * fStack_4f8;
    auVar55._12_4_ = fVar128 * fStack_4f4;
    auVar55._16_4_ = fStack_4f0 * 0.0;
    auVar55._20_4_ = fStack_4ec * 0.0;
    auVar55._24_4_ = fStack_4e8 * 0.0;
    auVar55._28_4_ = DAT_01f7b040._28_4_;
    auVar100 = vfmadd231ps_fma(auVar88,auVar84,auVar236);
    auVar153 = vfmadd231ps_fma(auVar11,auVar84,auVar250._0_32_);
    auVar76 = vfmadd231ps_fma(auVar182,auVar84,auVar260._0_32_);
    auVar70 = vfmadd231ps_fma(auVar55,auVar84,auVar265);
    auVar261._0_4_ = fVar97 * local_2a0;
    auVar261._4_4_ = fVar126 * fStack_29c;
    auVar261._8_4_ = fVar127 * fStack_298;
    auVar261._12_4_ = fVar128 * fStack_294;
    auVar261._16_4_ = fStack_290 * 0.0;
    auVar261._20_4_ = fStack_28c * 0.0;
    auVar261._28_36_ = auVar260._28_36_;
    auVar261._24_4_ = fStack_288 * 0.0;
    auVar233._0_4_ = fVar97 * (float)local_200;
    auVar233._4_4_ = fVar126 * local_200._4_4_;
    auVar233._8_4_ = fVar127 * (float)uStack_1f8;
    auVar233._12_4_ = fVar128 * uStack_1f8._4_4_;
    auVar233._16_4_ = (float)uStack_1f0 * 0.0;
    auVar233._20_4_ = uStack_1f0._4_4_ * 0.0;
    auVar233._28_36_ = auVar250._28_36_;
    auVar233._24_4_ = (float)uStack_1e8 * 0.0;
    auVar166._28_4_ = auVar202._28_4_;
    auVar166._0_28_ =
         ZEXT1628(CONCAT412(auVar100._12_4_ * fVar128,
                            CONCAT48(auVar100._8_4_ * fVar127,
                                     CONCAT44(auVar100._4_4_ * fVar126,auVar100._0_4_ * fVar97))));
    auVar79 = vfmadd231ps_fma(auVar166,auVar84,ZEXT1632(auVar79));
    auVar132 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar128 * auVar153._12_4_,
                                                  CONCAT48(fVar127 * auVar153._8_4_,
                                                           CONCAT44(fVar126 * auVar153._4_4_,
                                                                    fVar97 * auVar153._0_4_)))),
                               auVar84,ZEXT1632(auVar132));
    auVar165._28_4_ = auVar236._28_4_;
    auVar165._0_28_ =
         ZEXT1628(CONCAT412(fVar128 * auVar76._12_4_,
                            CONCAT48(fVar127 * auVar76._8_4_,
                                     CONCAT44(fVar126 * auVar76._4_4_,fVar97 * auVar76._0_4_))));
    auVar99 = vfmadd231ps_fma(auVar165,auVar84,ZEXT1632(auVar99));
    auVar71 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar128 * auVar70._12_4_,
                                                 CONCAT48(fVar127 * auVar70._8_4_,
                                                          CONCAT44(fVar126 * auVar70._4_4_,
                                                                   fVar97 * auVar70._0_4_)))),
                              auVar84,ZEXT1632(auVar71));
    auVar216._0_4_ = fVar97 * (float)local_220;
    auVar216._4_4_ = fVar126 * local_220._4_4_;
    auVar216._8_4_ = fVar127 * (float)uStack_218;
    auVar216._12_4_ = fVar128 * uStack_218._4_4_;
    auVar216._16_4_ = (float)uStack_210 * 0.0;
    auVar216._20_4_ = uStack_210._4_4_ * 0.0;
    auVar216._24_4_ = (float)uStack_208 * 0.0;
    auVar216._28_4_ = 0;
    auVar98 = vfmadd231ps_fma(auVar261._0_32_,auVar84,auVar144);
    auVar100 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar98._12_4_ * fVar128,
                                                  CONCAT48(auVar98._8_4_ * fVar127,
                                                           CONCAT44(auVar98._4_4_ * fVar126,
                                                                    auVar98._0_4_ * fVar97)))),
                               auVar84,ZEXT1632(auVar100));
    auVar227._0_4_ = fVar97 * (float)local_240;
    auVar227._4_4_ = fVar126 * local_240._4_4_;
    auVar227._8_4_ = fVar127 * (float)uStack_238;
    auVar227._12_4_ = fVar128 * uStack_238._4_4_;
    auVar227._16_4_ = (float)uStack_230 * 0.0;
    auVar227._20_4_ = uStack_230._4_4_ * 0.0;
    auVar227._24_4_ = (float)uStack_228 * 0.0;
    auVar227._28_4_ = 0;
    auVar85._4_4_ = fStack_4dc;
    auVar85._0_4_ = local_4e0;
    auVar85._8_4_ = fStack_4d8;
    auVar85._12_4_ = fStack_4d4;
    auVar85._16_4_ = fStack_4d0;
    auVar85._20_4_ = fStack_4cc;
    auVar85._24_4_ = fStack_4c8;
    auVar85._28_4_ = fStack_4c4;
    auVar98 = vfmadd231ps_fma(auVar233._0_32_,auVar84,auVar85);
    auVar172 = vfmadd231ps_fma(auVar216,auVar84,auVar54);
    auVar205._4_4_ = fStack_4fc;
    auVar205._0_4_ = local_500;
    auVar205._8_4_ = fStack_4f8;
    auVar205._12_4_ = fStack_4f4;
    auVar205._16_4_ = fStack_4f0;
    auVar205._20_4_ = fStack_4ec;
    auVar205._24_4_ = fStack_4e8;
    auVar205._28_4_ = fStack_4e4;
    auVar134 = vfmadd231ps_fma(auVar227,auVar84,auVar205);
    auVar56._28_4_ = fVar197;
    auVar56._0_28_ =
         ZEXT1628(CONCAT412(auVar134._12_4_ * fVar128,
                            CONCAT48(auVar134._8_4_ * fVar127,
                                     CONCAT44(auVar134._4_4_ * fVar126,auVar134._0_4_ * fVar97))));
    auVar153 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar98._12_4_ * fVar128,
                                                  CONCAT48(auVar98._8_4_ * fVar127,
                                                           CONCAT44(auVar98._4_4_ * fVar126,
                                                                    auVar98._0_4_ * fVar97)))),
                               auVar84,ZEXT1632(auVar153));
    auVar76 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar128 * auVar172._12_4_,
                                                 CONCAT48(fVar127 * auVar172._8_4_,
                                                          CONCAT44(fVar126 * auVar172._4_4_,
                                                                   fVar97 * auVar172._0_4_)))),
                              auVar84,ZEXT1632(auVar76));
    auVar70 = vfmadd231ps_fma(auVar56,auVar84,ZEXT1632(auVar70));
    auVar12._28_4_ = fStack_264;
    auVar12._0_28_ =
         ZEXT1628(CONCAT412(fVar128 * auVar76._12_4_,
                            CONCAT48(fVar127 * auVar76._8_4_,
                                     CONCAT44(fVar126 * auVar76._4_4_,fVar97 * auVar76._0_4_))));
    auVar98 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar100._12_4_ * fVar128,
                                                 CONCAT48(auVar100._8_4_ * fVar127,
                                                          CONCAT44(auVar100._4_4_ * fVar126,
                                                                   auVar100._0_4_ * fVar97)))),
                              auVar84,ZEXT1632(auVar79));
    auVar172 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar153._12_4_ * fVar128,
                                                  CONCAT48(auVar153._8_4_ * fVar127,
                                                           CONCAT44(auVar153._4_4_ * fVar126,
                                                                    auVar153._0_4_ * fVar97)))),
                               auVar84,ZEXT1632(auVar132));
    auVar134 = vfmadd231ps_fma(auVar12,auVar84,ZEXT1632(auVar99));
    auVar184 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar70._12_4_ * fVar128,
                                                  CONCAT48(auVar70._8_4_ * fVar127,
                                                           CONCAT44(auVar70._4_4_ * fVar126,
                                                                    auVar70._0_4_ * fVar97)))),
                               ZEXT1632(auVar71),auVar84);
    auVar144 = ZEXT1632(auVar184);
    auVar202 = vsubps_avx(ZEXT1632(auVar100),ZEXT1632(auVar79));
    auVar84 = vsubps_avx(ZEXT1632(auVar153),ZEXT1632(auVar132));
    auVar236 = vsubps_avx(ZEXT1632(auVar76),ZEXT1632(auVar99));
    auVar179 = vsubps_avx(ZEXT1632(auVar70),ZEXT1632(auVar71));
    fVar197 = fVar131 * auVar202._0_4_ * 3.0;
    fVar206 = fVar131 * auVar202._4_4_ * 3.0;
    local_980._4_4_ = fVar206;
    local_980._0_4_ = fVar197;
    fVar207 = fVar131 * auVar202._8_4_ * 3.0;
    local_980._8_4_ = fVar207;
    fVar208 = fVar131 * auVar202._12_4_ * 3.0;
    local_980._12_4_ = fVar208;
    fVar209 = fVar131 * auVar202._16_4_ * 3.0;
    local_980._16_4_ = fVar209;
    fVar210 = fVar131 * auVar202._20_4_ * 3.0;
    local_980._20_4_ = fVar210;
    fVar211 = fVar131 * auVar202._24_4_ * 3.0;
    local_980._24_4_ = fVar211;
    local_980._28_4_ = auVar236._28_4_;
    local_9c0._0_4_ = fVar131 * auVar84._0_4_ * 3.0;
    local_9c0._4_4_ = fVar131 * auVar84._4_4_ * 3.0;
    local_9c0._8_4_ = fVar131 * auVar84._8_4_ * 3.0;
    local_9c0._12_4_ = fVar131 * auVar84._12_4_ * 3.0;
    local_9c0._16_4_ = fVar131 * auVar84._16_4_ * 3.0;
    local_9c0._20_4_ = fVar131 * auVar84._20_4_ * 3.0;
    local_9c0._24_4_ = fVar131 * auVar84._24_4_ * 3.0;
    local_9c0._28_4_ = 0;
    auVar237._0_4_ = fVar131 * auVar236._0_4_ * 3.0;
    auVar237._4_4_ = fVar131 * auVar236._4_4_ * 3.0;
    auVar237._8_4_ = fVar131 * auVar236._8_4_ * 3.0;
    auVar237._12_4_ = fVar131 * auVar236._12_4_ * 3.0;
    auVar237._16_4_ = fVar131 * auVar236._16_4_ * 3.0;
    auVar237._20_4_ = fVar131 * auVar236._20_4_ * 3.0;
    auVar237._24_4_ = fVar131 * auVar236._24_4_ * 3.0;
    auVar237._28_4_ = 0;
    fVar97 = fVar131 * auVar179._0_4_ * 3.0;
    fVar126 = fVar131 * auVar179._4_4_ * 3.0;
    auVar13._4_4_ = fVar126;
    auVar13._0_4_ = fVar97;
    fVar127 = fVar131 * auVar179._8_4_ * 3.0;
    auVar13._8_4_ = fVar127;
    fVar128 = fVar131 * auVar179._12_4_ * 3.0;
    auVar13._12_4_ = fVar128;
    fVar129 = fVar131 * auVar179._16_4_ * 3.0;
    auVar13._16_4_ = fVar129;
    fVar130 = fVar131 * auVar179._20_4_ * 3.0;
    auVar13._20_4_ = fVar130;
    fVar131 = fVar131 * auVar179._24_4_ * 3.0;
    auVar13._24_4_ = fVar131;
    auVar13._28_4_ = auVar202._28_4_;
    local_920 = ZEXT1632(auVar98);
    auVar165 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar98));
    auVar12 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar172));
    auVar85 = ZEXT1632(auVar134);
    auVar205 = vpermps_avx2(_DAT_01fb7720,auVar85);
    local_2e0 = vsubps_avx(auVar165,local_920);
    local_2c0 = vsubps_avx(auVar205,ZEXT1632(auVar134));
    fVar171 = local_2c0._0_4_;
    fVar150 = local_2c0._4_4_;
    auVar14._4_4_ = fVar150 * fVar206;
    auVar14._0_4_ = fVar171 * fVar197;
    fVar197 = local_2c0._8_4_;
    auVar14._8_4_ = fVar197 * fVar207;
    fVar151 = local_2c0._12_4_;
    auVar14._12_4_ = fVar151 * fVar208;
    fVar152 = local_2c0._16_4_;
    auVar14._16_4_ = fVar152 * fVar209;
    fVar239 = local_2c0._20_4_;
    auVar14._20_4_ = fVar239 * fVar210;
    fVar244 = local_2c0._24_4_;
    auVar14._24_4_ = fVar244 * fVar211;
    auVar14._28_4_ = auVar205._28_4_;
    auVar79 = vfmsub231ps_fma(auVar14,auVar237,local_2e0);
    local_300 = vsubps_avx(auVar12,ZEXT1632(auVar172));
    fVar245 = local_2e0._0_4_;
    fVar246 = local_2e0._4_4_;
    auVar228._4_4_ = fVar246 * local_9c0._4_4_;
    auVar228._0_4_ = fVar245 * (float)local_9c0._0_4_;
    fVar251 = local_2e0._8_4_;
    auVar228._8_4_ = fVar251 * local_9c0._8_4_;
    fVar252 = local_2e0._12_4_;
    auVar228._12_4_ = fVar252 * local_9c0._12_4_;
    fVar253 = local_2e0._16_4_;
    auVar228._16_4_ = fVar253 * local_9c0._16_4_;
    fVar254 = local_2e0._20_4_;
    auVar228._20_4_ = fVar254 * local_9c0._20_4_;
    fVar255 = local_2e0._24_4_;
    auVar228._24_4_ = fVar255 * local_9c0._24_4_;
    auVar228._28_4_ = auVar165._28_4_;
    auVar132 = vfmsub231ps_fma(auVar228,local_980,local_300);
    auVar79 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar132._12_4_ * auVar132._12_4_,
                                                 CONCAT48(auVar132._8_4_ * auVar132._8_4_,
                                                          CONCAT44(auVar132._4_4_ * auVar132._4_4_,
                                                                   auVar132._0_4_ * auVar132._0_4_))
                                                )),ZEXT1632(auVar79),ZEXT1632(auVar79));
    auVar164._0_4_ = fVar171 * fVar171;
    auVar164._4_4_ = fVar150 * fVar150;
    auVar164._8_4_ = fVar197 * fVar197;
    auVar164._12_4_ = fVar151 * fVar151;
    auVar164._16_4_ = fVar152 * fVar152;
    auVar164._20_4_ = fVar239 * fVar239;
    auVar164._24_4_ = fVar244 * fVar244;
    auVar164._28_4_ = 0;
    auVar132 = vfmadd231ps_fma(auVar164,local_300,local_300);
    auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),local_2e0,local_2e0);
    fVar206 = local_300._0_4_;
    fVar207 = local_300._4_4_;
    auVar240._4_4_ = fVar207 * auVar237._4_4_;
    auVar240._0_4_ = fVar206 * auVar237._0_4_;
    fVar208 = local_300._8_4_;
    auVar240._8_4_ = fVar208 * auVar237._8_4_;
    fVar209 = local_300._12_4_;
    auVar240._12_4_ = fVar209 * auVar237._12_4_;
    fVar210 = local_300._16_4_;
    auVar240._16_4_ = fVar210 * auVar237._16_4_;
    fVar211 = local_300._20_4_;
    auVar240._20_4_ = fVar211 * auVar237._20_4_;
    fVar262 = local_300._24_4_;
    auVar240._24_4_ = fVar262 * auVar237._24_4_;
    auVar240._28_4_ = auVar12._28_4_;
    auVar84 = vrcpps_avx(ZEXT1632(auVar132));
    auVar99 = vfmsub231ps_fma(auVar240,local_9c0,local_2c0);
    auVar99 = vfmadd231ps_fma(ZEXT1632(auVar79),ZEXT1632(auVar99),ZEXT1632(auVar99));
    auVar86._8_4_ = 0x3f800000;
    auVar86._0_8_ = 0x3f8000003f800000;
    auVar86._12_4_ = 0x3f800000;
    auVar86._16_4_ = 0x3f800000;
    auVar86._20_4_ = 0x3f800000;
    auVar86._24_4_ = 0x3f800000;
    auVar86._28_4_ = 0x3f800000;
    auVar79 = vfnmadd213ps_fma(auVar84,ZEXT1632(auVar132),auVar86);
    auVar79 = vfmadd132ps_fma(ZEXT1632(auVar79),auVar84,auVar84);
    local_9e0 = vpermps_avx2(_DAT_01fb7720,local_980);
    local_a00 = vpermps_avx2(_DAT_01fb7720,auVar237);
    auVar257._4_4_ = fVar150 * local_9e0._4_4_;
    auVar257._0_4_ = fVar171 * local_9e0._0_4_;
    auVar257._8_4_ = fVar197 * local_9e0._8_4_;
    auVar257._12_4_ = fVar151 * local_9e0._12_4_;
    auVar257._16_4_ = fVar152 * local_9e0._16_4_;
    auVar257._20_4_ = fVar239 * local_9e0._20_4_;
    auVar257._24_4_ = fVar244 * local_9e0._24_4_;
    auVar257._28_4_ = auVar84._28_4_;
    auVar71 = vfmsub231ps_fma(auVar257,local_a00,local_2e0);
    local_740 = vpermps_avx2(_DAT_01fb7720,local_9c0);
    auVar270._4_4_ = fVar246 * local_740._4_4_;
    auVar270._0_4_ = fVar245 * local_740._0_4_;
    auVar270._8_4_ = fVar251 * local_740._8_4_;
    auVar270._12_4_ = fVar252 * local_740._12_4_;
    auVar270._16_4_ = fVar253 * local_740._16_4_;
    auVar270._20_4_ = fVar254 * local_740._20_4_;
    auVar270._24_4_ = fVar255 * local_740._24_4_;
    auVar270._28_4_ = auVar236._28_4_;
    auVar100 = vfmsub231ps_fma(auVar270,local_9e0,local_300);
    auVar71 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar100._12_4_ * auVar100._12_4_,
                                                 CONCAT48(auVar100._8_4_ * auVar100._8_4_,
                                                          CONCAT44(auVar100._4_4_ * auVar100._4_4_,
                                                                   auVar100._0_4_ * auVar100._0_4_))
                                                )),ZEXT1632(auVar71),ZEXT1632(auVar71));
    auVar192._0_4_ = fVar206 * local_a00._0_4_;
    auVar192._4_4_ = fVar207 * local_a00._4_4_;
    auVar192._8_4_ = fVar208 * local_a00._8_4_;
    auVar192._12_4_ = fVar209 * local_a00._12_4_;
    auVar192._16_4_ = fVar210 * local_a00._16_4_;
    auVar192._20_4_ = fVar211 * local_a00._20_4_;
    auVar192._24_4_ = fVar262 * local_a00._24_4_;
    auVar192._28_4_ = 0;
    auVar100 = vfmsub231ps_fma(auVar192,local_740,local_2c0);
    auVar71 = vfmadd231ps_fma(ZEXT1632(auVar71),ZEXT1632(auVar100),ZEXT1632(auVar100));
    auVar84 = vmaxps_avx(ZEXT1632(CONCAT412(auVar99._12_4_ * auVar79._12_4_,
                                            CONCAT48(auVar99._8_4_ * auVar79._8_4_,
                                                     CONCAT44(auVar99._4_4_ * auVar79._4_4_,
                                                              auVar99._0_4_ * auVar79._0_4_)))),
                         ZEXT1632(CONCAT412(auVar71._12_4_ * auVar79._12_4_,
                                            CONCAT48(auVar71._8_4_ * auVar79._8_4_,
                                                     CONCAT44(auVar71._4_4_ * auVar79._4_4_,
                                                              auVar71._0_4_ * auVar79._0_4_)))));
    local_7a0._0_4_ = auVar184._0_4_ + fVar97;
    local_7a0._4_4_ = auVar184._4_4_ + fVar126;
    local_7a0._8_4_ = auVar184._8_4_ + fVar127;
    local_7a0._12_4_ = auVar184._12_4_ + fVar128;
    local_7a0._16_4_ = fVar129 + 0.0;
    local_7a0._20_4_ = fVar130 + 0.0;
    local_7a0._24_4_ = fVar131 + 0.0;
    local_7a0._28_4_ = auVar202._28_4_ + 0.0;
    auVar202 = vsubps_avx(auVar144,auVar13);
    auVar13 = vpermps_avx2(_DAT_01fb7720,auVar202);
    auVar14 = vpermps_avx2(_DAT_01fb7720,auVar144);
    auVar202 = vmaxps_avx(auVar144,local_7a0);
    auVar179 = vrsqrtps_avx(ZEXT1632(auVar132));
    auVar236 = vmaxps_avx(auVar13,auVar14);
    auVar202 = vmaxps_avx(auVar202,auVar236);
    fVar97 = auVar179._0_4_;
    fVar126 = auVar179._4_4_;
    fVar127 = auVar179._8_4_;
    fVar128 = auVar179._12_4_;
    fVar131 = auVar179._16_4_;
    fVar129 = auVar179._20_4_;
    fVar130 = auVar179._24_4_;
    auVar9._4_4_ = fVar126 * fVar126 * fVar126 * auVar132._4_4_ * -0.5;
    auVar9._0_4_ = fVar97 * fVar97 * fVar97 * auVar132._0_4_ * -0.5;
    auVar9._8_4_ = fVar127 * fVar127 * fVar127 * auVar132._8_4_ * -0.5;
    auVar9._12_4_ = fVar128 * fVar128 * fVar128 * auVar132._12_4_ * -0.5;
    auVar9._16_4_ = fVar131 * fVar131 * fVar131 * -0.0;
    auVar9._20_4_ = fVar129 * fVar129 * fVar129 * -0.0;
    auVar9._24_4_ = fVar130 * fVar130 * fVar130 * -0.0;
    auVar9._28_4_ = local_740._28_4_;
    auVar115._8_4_ = 0x3fc00000;
    auVar115._0_8_ = 0x3fc000003fc00000;
    auVar115._12_4_ = 0x3fc00000;
    auVar115._16_4_ = 0x3fc00000;
    auVar115._20_4_ = 0x3fc00000;
    auVar115._24_4_ = 0x3fc00000;
    auVar115._28_4_ = 0x3fc00000;
    auVar79 = vfmadd231ps_fma(auVar9,auVar115,auVar179);
    fVar126 = auVar79._0_4_;
    fVar127 = auVar79._4_4_;
    auVar16._4_4_ = fVar207 * fVar127;
    auVar16._0_4_ = fVar206 * fVar126;
    fVar131 = auVar79._8_4_;
    auVar16._8_4_ = fVar208 * fVar131;
    fVar130 = auVar79._12_4_;
    auVar16._12_4_ = fVar209 * fVar130;
    auVar16._16_4_ = fVar210 * 0.0;
    auVar16._20_4_ = fVar211 * 0.0;
    auVar16._24_4_ = fVar262 * 0.0;
    auVar16._28_4_ = 0;
    auVar17._4_4_ = (float)local_7e0._4_4_ * fVar150 * fVar127;
    auVar17._0_4_ = (float)local_7e0._0_4_ * fVar171 * fVar126;
    auVar17._8_4_ = fStack_7d8 * fVar197 * fVar131;
    auVar17._12_4_ = fStack_7d4 * fVar151 * fVar130;
    auVar17._16_4_ = fStack_7d0 * fVar152 * 0.0;
    auVar17._20_4_ = fStack_7cc * fVar239 * 0.0;
    auVar17._24_4_ = fStack_7c8 * fVar244 * 0.0;
    auVar17._28_4_ = local_2c0._28_4_;
    auVar132 = vfmadd231ps_fma(auVar17,auVar16,_local_7c0);
    auVar179 = vsubps_avx(ZEXT832(0) << 0x20,auVar85);
    fVar206 = auVar179._0_4_;
    fVar207 = auVar179._4_4_;
    auVar18._4_4_ = fVar207 * fVar150 * fVar127;
    auVar18._0_4_ = fVar206 * fVar171 * fVar126;
    fVar208 = auVar179._8_4_;
    auVar18._8_4_ = fVar208 * fVar197 * fVar131;
    fVar209 = auVar179._12_4_;
    auVar18._12_4_ = fVar209 * fVar151 * fVar130;
    fVar210 = auVar179._16_4_;
    auVar18._16_4_ = fVar210 * fVar152 * 0.0;
    fVar211 = auVar179._20_4_;
    auVar18._20_4_ = fVar211 * fVar239 * 0.0;
    fVar171 = auVar179._24_4_;
    auVar18._24_4_ = fVar171 * fVar244 * 0.0;
    auVar18._28_4_ = (int)((ulong)uStack_1c8 >> 0x20);
    auVar228 = ZEXT1632(auVar172);
    auVar10 = vsubps_avx(ZEXT832(0) << 0x20,auVar228);
    auVar99 = vfmadd231ps_fma(auVar18,auVar10,auVar16);
    auVar19._4_4_ = fVar246 * fVar127;
    auVar19._0_4_ = fVar245 * fVar126;
    auVar19._8_4_ = fVar251 * fVar131;
    auVar19._12_4_ = fVar252 * fVar130;
    auVar19._16_4_ = fVar253 * 0.0;
    auVar19._20_4_ = fVar254 * 0.0;
    auVar19._24_4_ = fVar255 * 0.0;
    auVar19._28_4_ = auVar236._28_4_;
    auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar19,_local_640);
    auVar243 = ZEXT1664(auVar132);
    auVar257 = ZEXT832(0) << 0x20;
    auVar88 = vsubps_avx(auVar257,local_920);
    auVar99 = vfmadd231ps_fma(ZEXT1632(auVar99),auVar88,auVar19);
    auVar20._4_4_ = (float)local_7e0._4_4_ * fVar207;
    auVar20._0_4_ = (float)local_7e0._0_4_ * fVar206;
    auVar20._8_4_ = fStack_7d8 * fVar208;
    auVar20._12_4_ = fStack_7d4 * fVar209;
    auVar20._16_4_ = fStack_7d0 * fVar210;
    auVar20._20_4_ = fStack_7cc * fVar211;
    auVar20._24_4_ = fStack_7c8 * fVar171;
    auVar20._28_4_ = auVar236._28_4_;
    auVar71 = vfmadd231ps_fma(auVar20,_local_7c0,auVar10);
    auVar71 = vfmadd231ps_fma(ZEXT1632(auVar71),_local_640,auVar88);
    fVar97 = auVar99._0_4_;
    fVar239 = auVar132._0_4_;
    fVar128 = auVar99._4_4_;
    fVar244 = auVar132._4_4_;
    fVar129 = auVar99._8_4_;
    fVar245 = auVar132._8_4_;
    fVar197 = auVar99._12_4_;
    fVar246 = auVar132._12_4_;
    auVar21._28_4_ = uStack_7c4;
    auVar21._0_28_ =
         ZEXT1628(CONCAT412(fVar246 * fVar197,
                            CONCAT48(fVar245 * fVar129,CONCAT44(fVar244 * fVar128,fVar239 * fVar97))
                           ));
    auVar11 = vsubps_avx(ZEXT1632(auVar71),auVar21);
    auVar22._4_4_ = fVar207 * fVar207;
    auVar22._0_4_ = fVar206 * fVar206;
    auVar22._8_4_ = fVar208 * fVar208;
    auVar22._12_4_ = fVar209 * fVar209;
    auVar22._16_4_ = fVar210 * fVar210;
    auVar22._20_4_ = fVar211 * fVar211;
    auVar22._24_4_ = fVar171 * fVar171;
    auVar22._28_4_ = uStack_7c4;
    auVar71 = vfmadd231ps_fma(auVar22,auVar10,auVar10);
    auVar71 = vfmadd231ps_fma(ZEXT1632(auVar71),auVar88,auVar88);
    auVar23._28_4_ = local_2e0._28_4_;
    auVar23._0_28_ =
         ZEXT1628(CONCAT412(fVar197 * fVar197,
                            CONCAT48(fVar129 * fVar129,CONCAT44(fVar128 * fVar128,fVar97 * fVar97)))
                 );
    auVar182 = vsubps_avx(ZEXT1632(auVar71),auVar23);
    auVar236 = vsqrtps_avx(auVar84);
    fVar97 = (auVar202._0_4_ + auVar236._0_4_) * 1.0000002;
    fVar128 = (auVar202._4_4_ + auVar236._4_4_) * 1.0000002;
    fVar129 = (auVar202._8_4_ + auVar236._8_4_) * 1.0000002;
    fVar197 = (auVar202._12_4_ + auVar236._12_4_) * 1.0000002;
    fVar150 = (auVar202._16_4_ + auVar236._16_4_) * 1.0000002;
    fVar151 = (auVar202._20_4_ + auVar236._20_4_) * 1.0000002;
    fVar152 = (auVar202._24_4_ + auVar236._24_4_) * 1.0000002;
    auVar24._4_4_ = fVar128 * fVar128;
    auVar24._0_4_ = fVar97 * fVar97;
    auVar24._8_4_ = fVar129 * fVar129;
    auVar24._12_4_ = fVar197 * fVar197;
    auVar24._16_4_ = fVar150 * fVar150;
    auVar24._20_4_ = fVar151 * fVar151;
    auVar24._24_4_ = fVar152 * fVar152;
    auVar24._28_4_ = auVar202._28_4_ + auVar236._28_4_;
    fVar128 = auVar11._0_4_ + auVar11._0_4_;
    fVar129 = auVar11._4_4_ + auVar11._4_4_;
    local_340._0_8_ = CONCAT44(fVar129,fVar128);
    local_340._8_4_ = auVar11._8_4_ + auVar11._8_4_;
    local_340._12_4_ = auVar11._12_4_ + auVar11._12_4_;
    local_340._16_4_ = auVar11._16_4_ + auVar11._16_4_;
    local_340._20_4_ = auVar11._20_4_ + auVar11._20_4_;
    local_340._24_4_ = auVar11._24_4_ + auVar11._24_4_;
    fVar97 = auVar11._28_4_;
    local_340._28_4_ = fVar97 + fVar97;
    auVar202 = vsubps_avx(auVar182,auVar24);
    auVar240 = ZEXT1632(auVar132);
    local_320._28_4_ = auVar182._28_4_;
    local_320._0_28_ =
         ZEXT1628(CONCAT412(fVar246 * fVar246,
                            CONCAT48(fVar245 * fVar245,CONCAT44(fVar244 * fVar244,fVar239 * fVar239)
                                    )));
    auVar11 = vsubps_avx(local_260,local_320);
    auVar25._4_4_ = fVar129 * fVar129;
    auVar25._0_4_ = fVar128 * fVar128;
    auVar25._8_4_ = local_340._8_4_ * local_340._8_4_;
    auVar25._12_4_ = local_340._12_4_ * local_340._12_4_;
    auVar25._16_4_ = local_340._16_4_ * local_340._16_4_;
    auVar25._20_4_ = local_340._20_4_ * local_340._20_4_;
    auVar25._24_4_ = local_340._24_4_ * local_340._24_4_;
    auVar25._28_4_ = fVar97;
    fVar97 = auVar11._0_4_;
    fVar128 = auVar11._4_4_;
    fVar129 = auVar11._8_4_;
    fVar197 = auVar11._12_4_;
    fVar150 = auVar11._16_4_;
    fVar151 = auVar11._20_4_;
    fVar152 = auVar11._24_4_;
    auVar26._4_4_ = fVar128 * 4.0 * auVar202._4_4_;
    auVar26._0_4_ = fVar97 * 4.0 * auVar202._0_4_;
    auVar26._8_4_ = fVar129 * 4.0 * auVar202._8_4_;
    auVar26._12_4_ = fVar197 * 4.0 * auVar202._12_4_;
    auVar26._16_4_ = fVar150 * 4.0 * auVar202._16_4_;
    auVar26._20_4_ = fVar151 * 4.0 * auVar202._20_4_;
    auVar26._24_4_ = fVar152 * 4.0 * auVar202._24_4_;
    auVar26._28_4_ = 0x40800000;
    auVar166 = vsubps_avx(auVar25,auVar26);
    auVar84 = vcmpps_avx(auVar166,auVar257,5);
    local_360._0_4_ = fVar97 + fVar97;
    local_360._4_4_ = fVar128 + fVar128;
    local_360._8_4_ = fVar129 + fVar129;
    local_360._12_4_ = fVar197 + fVar197;
    local_360._16_4_ = fVar150 + fVar150;
    local_360._20_4_ = fVar151 + fVar151;
    local_360._24_4_ = fVar152 + fVar152;
    local_360._28_4_ = auVar11._28_4_ + auVar11._28_4_;
    auVar270 = ZEXT1632(auVar99);
    if ((((((((auVar84 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar84 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar84 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar84 >> 0x7f,0) == '\0') &&
          (auVar84 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar84 >> 0xbf,0) == '\0') &&
        (auVar84 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar84[0x1f]) {
      auVar217._8_4_ = 0x7f800000;
      auVar217._0_8_ = 0x7f8000007f800000;
      auVar217._12_4_ = 0x7f800000;
      auVar217._16_4_ = 0x7f800000;
      auVar217._20_4_ = 0x7f800000;
      auVar217._24_4_ = 0x7f800000;
      auVar217._28_4_ = 0x7f800000;
      auVar87._8_4_ = 0xff800000;
      auVar87._0_8_ = 0xff800000ff800000;
      auVar87._12_4_ = 0xff800000;
      auVar87._16_4_ = 0xff800000;
      auVar87._20_4_ = 0xff800000;
      auVar87._24_4_ = 0xff800000;
      auVar87._28_4_ = 0xff800000;
    }
    else {
      auVar9 = vsqrtps_avx(auVar166);
      auVar257 = vcmpps_avx(auVar166,auVar257,5);
      auVar166 = vrcpps_avx(local_360);
      auVar218._8_4_ = 0x3f800000;
      auVar218._0_8_ = 0x3f8000003f800000;
      auVar218._12_4_ = 0x3f800000;
      auVar218._16_4_ = 0x3f800000;
      auVar218._20_4_ = 0x3f800000;
      auVar218._24_4_ = 0x3f800000;
      auVar218._28_4_ = 0x3f800000;
      auVar132 = vfnmadd213ps_fma(auVar166,local_360,auVar218);
      auVar132 = vfmadd132ps_fma(ZEXT1632(auVar132),auVar166,auVar166);
      auVar266._0_8_ = local_340._0_8_ ^ 0x8000000080000000;
      auVar266._8_4_ = -local_340._8_4_;
      auVar266._12_4_ = -local_340._12_4_;
      auVar266._16_4_ = -local_340._16_4_;
      auVar266._20_4_ = -local_340._20_4_;
      auVar266._24_4_ = -local_340._24_4_;
      auVar266._28_4_ = -local_340._28_4_;
      auVar166 = vsubps_avx(auVar266,auVar9);
      auVar27._4_4_ = auVar166._4_4_ * auVar132._4_4_;
      auVar27._0_4_ = auVar166._0_4_ * auVar132._0_4_;
      auVar27._8_4_ = auVar166._8_4_ * auVar132._8_4_;
      auVar27._12_4_ = auVar166._12_4_ * auVar132._12_4_;
      auVar27._16_4_ = auVar166._16_4_ * 0.0;
      auVar27._20_4_ = auVar166._20_4_ * 0.0;
      auVar27._24_4_ = auVar166._24_4_ * 0.0;
      auVar27._28_4_ = auVar166._28_4_;
      auVar166 = vsubps_avx(auVar9,local_340);
      auVar249._0_4_ = auVar132._0_4_ * auVar166._0_4_;
      auVar249._4_4_ = auVar132._4_4_ * auVar166._4_4_;
      auVar249._8_4_ = auVar132._8_4_ * auVar166._8_4_;
      auVar249._12_4_ = auVar132._12_4_ * auVar166._12_4_;
      auVar249._16_4_ = auVar166._16_4_ * 0.0;
      auVar249._20_4_ = auVar166._20_4_ * 0.0;
      auVar249._24_4_ = auVar166._24_4_ * 0.0;
      auVar249._28_4_ = 0;
      auVar132 = vfmadd213ps_fma(auVar240,auVar27,auVar270);
      local_3e0 = fVar126 * auVar132._0_4_;
      fStack_3dc = fVar127 * auVar132._4_4_;
      fStack_3d8 = fVar131 * auVar132._8_4_;
      fStack_3d4 = fVar130 * auVar132._12_4_;
      uStack_3d0 = 0;
      uStack_3cc = 0;
      uStack_3c8 = 0;
      uStack_3c4 = 0x80000000;
      auVar166 = vandps_avx(local_800,local_320);
      auVar166 = vmaxps_avx(local_580,auVar166);
      auVar28._4_4_ = auVar166._4_4_ * 1.9073486e-06;
      auVar28._0_4_ = auVar166._0_4_ * 1.9073486e-06;
      auVar28._8_4_ = auVar166._8_4_ * 1.9073486e-06;
      auVar28._12_4_ = auVar166._12_4_ * 1.9073486e-06;
      auVar28._16_4_ = auVar166._16_4_ * 1.9073486e-06;
      auVar28._20_4_ = auVar166._20_4_ * 1.9073486e-06;
      auVar28._24_4_ = auVar166._24_4_ * 1.9073486e-06;
      auVar28._28_4_ = auVar166._28_4_;
      auVar166 = vandps_avx(auVar11,local_800);
      auVar166 = vcmpps_avx(auVar166,auVar28,1);
      auVar132 = vfmadd213ps_fma(auVar240,auVar249,auVar270);
      auVar219._8_4_ = 0x7f800000;
      auVar219._0_8_ = 0x7f8000007f800000;
      auVar219._12_4_ = 0x7f800000;
      auVar219._16_4_ = 0x7f800000;
      auVar219._20_4_ = 0x7f800000;
      auVar219._24_4_ = 0x7f800000;
      auVar219._28_4_ = 0x7f800000;
      auVar217 = vblendvps_avx(auVar219,auVar27,auVar257);
      local_400 = fVar126 * auVar132._0_4_;
      fStack_3fc = fVar127 * auVar132._4_4_;
      fStack_3f8 = fVar131 * auVar132._8_4_;
      fStack_3f4 = fVar130 * auVar132._12_4_;
      uStack_3f0 = 0;
      uStack_3ec = 0;
      uStack_3e8 = 0;
      uStack_3e4 = 0x80000000;
      auVar258._8_4_ = 0xff800000;
      auVar258._0_8_ = 0xff800000ff800000;
      auVar258._12_4_ = 0xff800000;
      auVar258._16_4_ = 0xff800000;
      auVar258._20_4_ = 0xff800000;
      auVar258._24_4_ = 0xff800000;
      auVar258._28_4_ = 0xff800000;
      auVar87 = vblendvps_avx(auVar258,auVar249,auVar257);
      auVar9 = auVar257 & auVar166;
      if ((((((((auVar9 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar9 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar9 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar9 >> 0x7f,0) != '\0') ||
            (auVar9 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar9 >> 0xbf,0) != '\0') ||
          (auVar9 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar9[0x1f] < '\0')
      {
        auVar84 = vandps_avx(auVar166,auVar257);
        auVar166 = vcmpps_avx(auVar202,_DAT_01f7b000,2);
        auVar268._8_4_ = 0xff800000;
        auVar268._0_8_ = 0xff800000ff800000;
        auVar268._12_4_ = 0xff800000;
        auVar268._16_4_ = 0xff800000;
        auVar268._20_4_ = 0xff800000;
        auVar268._24_4_ = 0xff800000;
        auVar268._28_4_ = 0xff800000;
        auVar224._8_4_ = 0x7f800000;
        auVar224._0_8_ = 0x7f8000007f800000;
        auVar224._12_4_ = 0x7f800000;
        auVar224._16_4_ = 0x7f800000;
        auVar224._20_4_ = 0x7f800000;
        auVar224._24_4_ = 0x7f800000;
        auVar224._28_4_ = 0x7f800000;
        auVar202 = vblendvps_avx(auVar224,auVar268,auVar166);
        auVar132 = vpackssdw_avx(auVar84._0_16_,auVar84._16_16_);
        auVar9 = vpmovsxwd_avx2(auVar132);
        auVar217 = vblendvps_avx(auVar217,auVar202,auVar9);
        auVar202 = vblendvps_avx(auVar268,auVar224,auVar166);
        auVar87 = vblendvps_avx(auVar87,auVar202,auVar9);
        auVar148._0_8_ = auVar84._0_8_ ^ 0xffffffffffffffff;
        auVar148._8_4_ = auVar84._8_4_ ^ 0xffffffff;
        auVar148._12_4_ = auVar84._12_4_ ^ 0xffffffff;
        auVar148._16_4_ = auVar84._16_4_ ^ 0xffffffff;
        auVar148._20_4_ = auVar84._20_4_ ^ 0xffffffff;
        auVar148._24_4_ = auVar84._24_4_ ^ 0xffffffff;
        auVar148._28_4_ = auVar84._28_4_ ^ 0xffffffff;
        auVar84 = vorps_avx(auVar166,auVar148);
        auVar84 = vandps_avx(auVar257,auVar84);
      }
    }
    uStack_644 = 0x80000000;
    uStack_648 = 0x80000000;
    uStack_64c = 0x80000000;
    uStack_650 = 0x80000000;
    uStack_654 = 0x80000000;
    uStack_658 = 0x80000000;
    uStack_65c = 0x80000000;
    local_660 = 0x80000000;
    auVar233 = ZEXT1664(auVar79);
    auVar250 = ZEXT3264(CONCAT824(uStack_928,CONCAT816(uStack_930,CONCAT88(uStack_938,local_940))));
    auVar202 = local_520 & auVar84;
    if ((((((((auVar202 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar202 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar202 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar202 >> 0x7f,0) == '\0') &&
          (auVar202 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar202 >> 0xbf,0) == '\0') &&
        (auVar202 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar202[0x1f])
    {
LAB_01195fe4:
      auVar260 = ZEXT3264(local_900);
      auVar271 = ZEXT3264(local_9a0);
      fVar97 = (float)local_880._0_4_;
      fVar126 = (float)local_880._4_4_;
      fVar127 = fStack_878;
      fVar128 = fStack_874;
      fVar131 = fStack_870;
      fVar129 = fStack_86c;
      fVar130 = fStack_868;
      fVar197 = fStack_864;
    }
    else {
      local_420 = ZEXT1632(auVar79);
      auVar233 = ZEXT464((uint)*(float *)(ray + k * 4 + 0x80));
      fVar239 = *(float *)(ray + k * 4 + 0x80) - (float)local_8c0._0_4_;
      auVar193._4_4_ = fVar239;
      auVar193._0_4_ = fVar239;
      auVar193._8_4_ = fVar239;
      auVar193._12_4_ = fVar239;
      auVar193._16_4_ = fVar239;
      auVar193._20_4_ = fVar239;
      auVar193._24_4_ = fVar239;
      auVar193._28_4_ = fVar239;
      auVar166 = vminps_avx(auVar193,auVar87);
      auVar29._4_4_ = fVar207 * auVar237._4_4_;
      auVar29._0_4_ = fVar206 * auVar237._0_4_;
      auVar29._8_4_ = fVar208 * auVar237._8_4_;
      auVar29._12_4_ = fVar209 * auVar237._12_4_;
      auVar29._16_4_ = fVar210 * auVar237._16_4_;
      auVar29._20_4_ = fVar211 * auVar237._20_4_;
      auVar29._24_4_ = fVar171 * auVar237._24_4_;
      auVar29._28_4_ = auVar179._28_4_;
      auVar79 = vfmadd213ps_fma(auVar10,local_9c0,auVar29);
      auVar53._4_4_ = fStack_3bc;
      auVar53._0_4_ = local_3c0;
      auVar53._8_4_ = fStack_3b8;
      auVar53._12_4_ = fStack_3b4;
      auVar53._16_4_ = fStack_3b0;
      auVar53._20_4_ = fStack_3ac;
      auVar53._24_4_ = fStack_3a8;
      auVar53._28_4_ = fStack_3a4;
      auVar10 = vmaxps_avx(auVar53,auVar217);
      auVar132 = vfmadd213ps_fma(auVar88,local_980,ZEXT1632(auVar79));
      auVar30._4_4_ = auVar237._4_4_ * (float)local_7e0._4_4_;
      auVar30._0_4_ = auVar237._0_4_ * (float)local_7e0._0_4_;
      auVar30._8_4_ = auVar237._8_4_ * fStack_7d8;
      auVar30._12_4_ = auVar237._12_4_ * fStack_7d4;
      auVar30._16_4_ = auVar237._16_4_ * fStack_7d0;
      auVar30._20_4_ = auVar237._20_4_ * fStack_7cc;
      auVar30._24_4_ = auVar237._24_4_ * fStack_7c8;
      auVar30._28_4_ = 0;
      auVar79 = vfmadd231ps_fma(auVar30,local_9c0,_local_7c0);
      auVar99 = vfmadd231ps_fma(ZEXT1632(auVar79),_local_640,local_980);
      auVar202 = vandps_avx(ZEXT1632(auVar99),local_800);
      auVar220._8_4_ = 0x219392ef;
      auVar220._0_8_ = 0x219392ef219392ef;
      auVar220._12_4_ = 0x219392ef;
      auVar220._16_4_ = 0x219392ef;
      auVar220._20_4_ = 0x219392ef;
      auVar220._24_4_ = 0x219392ef;
      auVar220._28_4_ = 0x219392ef;
      auVar179 = vcmpps_avx(auVar202,auVar220,1);
      auVar202 = vrcpps_avx(ZEXT1632(auVar99));
      auVar221._8_4_ = 0x3f800000;
      auVar221._0_8_ = 0x3f8000003f800000;
      auVar221._12_4_ = 0x3f800000;
      auVar221._16_4_ = 0x3f800000;
      auVar221._20_4_ = 0x3f800000;
      auVar221._24_4_ = 0x3f800000;
      auVar221._28_4_ = 0x3f800000;
      auVar88 = ZEXT1632(auVar99);
      auVar79 = vfnmadd213ps_fma(auVar202,auVar88,auVar221);
      auVar79 = vfmadd132ps_fma(ZEXT1632(auVar79),auVar202,auVar202);
      auVar203._0_8_ = auVar99._0_8_ ^ 0x8000000080000000;
      auVar203._8_4_ = auVar99._8_4_ ^ 0x80000000;
      auVar203._12_4_ = auVar99._12_4_ ^ 0x80000000;
      auVar203._16_4_ = 0x80000000;
      auVar203._20_4_ = 0x80000000;
      auVar203._24_4_ = 0x80000000;
      auVar203._28_4_ = 0x80000000;
      auVar31._4_4_ = auVar79._4_4_ * -auVar132._4_4_;
      auVar31._0_4_ = auVar79._0_4_ * -auVar132._0_4_;
      auVar31._8_4_ = auVar79._8_4_ * -auVar132._8_4_;
      auVar31._12_4_ = auVar79._12_4_ * -auVar132._12_4_;
      auVar31._16_4_ = 0x80000000;
      auVar31._20_4_ = 0x80000000;
      auVar31._24_4_ = 0x80000000;
      auVar31._28_4_ = 0x80000000;
      auVar202 = vcmpps_avx(auVar88,auVar203,1);
      auVar202 = vorps_avx(auVar202,auVar179);
      auVar259._8_4_ = 0xff800000;
      auVar259._0_8_ = 0xff800000ff800000;
      auVar259._12_4_ = 0xff800000;
      auVar259._16_4_ = 0xff800000;
      auVar259._20_4_ = 0xff800000;
      auVar259._24_4_ = 0xff800000;
      auVar259._28_4_ = 0xff800000;
      auVar202 = vblendvps_avx(auVar31,auVar259,auVar202);
      auVar10 = vmaxps_avx(auVar10,auVar202);
      auVar202 = vcmpps_avx(auVar88,auVar203,6);
      auVar202 = vorps_avx(auVar179,auVar202);
      auVar267._8_4_ = 0x7f800000;
      auVar267._0_8_ = 0x7f8000007f800000;
      auVar267._12_4_ = 0x7f800000;
      auVar267._16_4_ = 0x7f800000;
      auVar267._20_4_ = 0x7f800000;
      auVar267._24_4_ = 0x7f800000;
      auVar267._28_4_ = 0x7f800000;
      auVar202 = vblendvps_avx(auVar31,auVar267,auVar202);
      auVar88 = vminps_avx(auVar166,auVar202);
      fVar206 = -local_a00._0_4_;
      fVar207 = -local_a00._4_4_;
      fVar208 = -local_a00._8_4_;
      fVar209 = -local_a00._12_4_;
      fVar210 = -local_a00._16_4_;
      fVar211 = -local_a00._20_4_;
      fVar171 = -local_a00._24_4_;
      auVar181._0_8_ = local_740._0_8_ ^ 0x8000000080000000;
      auVar181._8_4_ = -local_740._8_4_;
      auVar181._12_4_ = -local_740._12_4_;
      auVar181._16_4_ = -local_740._16_4_;
      auVar181._20_4_ = -local_740._20_4_;
      auVar181._24_4_ = -local_740._24_4_;
      auVar181._28_4_ = local_740._28_4_ ^ 0x80000000;
      auVar202 = vsubps_avx(ZEXT832(0) << 0x20,auVar12);
      auVar179 = vsubps_avx(ZEXT832(0) << 0x20,auVar205);
      auVar32._4_4_ = auVar179._4_4_ * fVar207;
      auVar32._0_4_ = auVar179._0_4_ * fVar206;
      auVar32._8_4_ = auVar179._8_4_ * fVar208;
      auVar32._12_4_ = auVar179._12_4_ * fVar209;
      auVar32._16_4_ = auVar179._16_4_ * fVar210;
      auVar32._20_4_ = auVar179._20_4_ * fVar211;
      auVar32._24_4_ = auVar179._24_4_ * fVar171;
      auVar32._28_4_ = auVar179._28_4_;
      auVar79 = vfmadd231ps_fma(auVar32,auVar181,auVar202);
      auVar194._0_8_ = local_9e0._0_8_ ^ 0x8000000080000000;
      auVar194._8_4_ = -local_9e0._8_4_;
      auVar194._12_4_ = -local_9e0._12_4_;
      auVar194._16_4_ = -local_9e0._16_4_;
      auVar194._20_4_ = -local_9e0._20_4_;
      auVar194._24_4_ = -local_9e0._24_4_;
      auVar194._28_4_ = local_9e0._28_4_ ^ 0x80000000;
      auVar202 = vsubps_avx(ZEXT832(0) << 0x20,auVar165);
      auVar132 = vfmadd231ps_fma(ZEXT1632(auVar79),auVar194,auVar202);
      auVar33._4_4_ = fVar207 * (float)local_7e0._4_4_;
      auVar33._0_4_ = fVar206 * (float)local_7e0._0_4_;
      auVar33._8_4_ = fVar208 * fStack_7d8;
      auVar33._12_4_ = fVar209 * fStack_7d4;
      auVar33._16_4_ = fVar210 * fStack_7d0;
      auVar33._20_4_ = fVar211 * fStack_7cc;
      auVar33._24_4_ = fVar171 * fStack_7c8;
      auVar33._28_4_ = local_a00._28_4_ ^ 0x80000000;
      auVar79 = vfmadd231ps_fma(auVar33,auVar181,_local_7c0);
      auVar99 = vfmadd231ps_fma(ZEXT1632(auVar79),_local_640,auVar194);
      auVar202 = vandps_avx(ZEXT1632(auVar99),local_800);
      auVar166 = vrcpps_avx(ZEXT1632(auVar99));
      auVar116._8_4_ = 0x219392ef;
      auVar116._0_8_ = 0x219392ef219392ef;
      auVar116._12_4_ = 0x219392ef;
      auVar116._16_4_ = 0x219392ef;
      auVar116._20_4_ = 0x219392ef;
      auVar116._24_4_ = 0x219392ef;
      auVar116._28_4_ = 0x219392ef;
      auVar179 = vcmpps_avx(auVar202,auVar116,1);
      auVar165 = ZEXT1632(auVar99);
      auVar79 = vfnmadd213ps_fma(auVar166,auVar165,auVar221);
      auVar79 = vfmadd132ps_fma(ZEXT1632(auVar79),auVar166,auVar166);
      auVar195._0_8_ = auVar99._0_8_ ^ 0x8000000080000000;
      auVar195._8_4_ = auVar99._8_4_ ^ 0x80000000;
      auVar195._12_4_ = auVar99._12_4_ ^ 0x80000000;
      auVar195._16_4_ = 0x80000000;
      auVar195._20_4_ = 0x80000000;
      auVar195._24_4_ = 0x80000000;
      auVar195._28_4_ = 0x80000000;
      auVar34._4_4_ = auVar79._4_4_ * -auVar132._4_4_;
      auVar34._0_4_ = auVar79._0_4_ * -auVar132._0_4_;
      auVar34._8_4_ = auVar79._8_4_ * -auVar132._8_4_;
      auVar34._12_4_ = auVar79._12_4_ * -auVar132._12_4_;
      auVar34._16_4_ = 0x80000000;
      auVar34._20_4_ = 0x80000000;
      auVar34._24_4_ = 0x80000000;
      auVar34._28_4_ = 0x80000000;
      auVar202 = vcmpps_avx(auVar165,auVar195,1);
      auVar202 = vorps_avx(auVar202,auVar179);
      auVar117._8_4_ = 0xff800000;
      auVar117._0_8_ = 0xff800000ff800000;
      auVar117._12_4_ = 0xff800000;
      auVar117._16_4_ = 0xff800000;
      auVar117._20_4_ = 0xff800000;
      auVar117._24_4_ = 0xff800000;
      auVar117._28_4_ = 0xff800000;
      auVar202 = vblendvps_avx(auVar34,auVar117,auVar202);
      auVar10 = vmaxps_avx(auVar10,auVar202);
      auVar202 = vcmpps_avx(auVar165,auVar195,6);
      auVar202 = vorps_avx(auVar179,auVar202);
      auVar202 = vblendvps_avx(auVar34,auVar267,auVar202);
      auVar84 = vandps_avx(auVar84,local_520);
      local_440 = vminps_avx(auVar88,auVar202);
      auVar202 = vcmpps_avx(auVar10,local_440,2);
      auVar179 = auVar84 & auVar202;
      if ((((((((auVar179 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar179 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar179 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar179 >> 0x7f,0) == '\0') &&
            (auVar179 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar179 >> 0xbf,0) == '\0') &&
          (auVar179 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar179[0x1f]) {
        auVar250 = ZEXT3264(CONCAT824(uStack_928,
                                      CONCAT816(uStack_930,CONCAT88(uStack_938,local_940))));
        goto LAB_01195fe4;
      }
      auVar52._4_4_ = fStack_3dc;
      auVar52._0_4_ = local_3e0;
      auVar52._8_4_ = fStack_3d8;
      auVar52._12_4_ = fStack_3d4;
      auVar52._16_4_ = uStack_3d0;
      auVar52._20_4_ = uStack_3cc;
      auVar52._24_4_ = uStack_3c8;
      auVar52._28_4_ = uStack_3c4;
      auVar204._8_4_ = 0x3f800000;
      auVar204._0_8_ = 0x3f8000003f800000;
      auVar204._12_4_ = 0x3f800000;
      auVar204._16_4_ = 0x3f800000;
      auVar204._20_4_ = 0x3f800000;
      auVar204._24_4_ = 0x3f800000;
      auVar204._28_4_ = 0x3f800000;
      auVar179 = vminps_avx(auVar52,auVar204);
      auVar166 = SUB6432(ZEXT864(0),0) << 0x20;
      auVar179 = vmaxps_avx(auVar179,ZEXT832(0) << 0x20);
      auVar51._4_4_ = fStack_3fc;
      auVar51._0_4_ = local_400;
      auVar51._8_4_ = fStack_3f8;
      auVar51._12_4_ = fStack_3f4;
      auVar51._16_4_ = uStack_3f0;
      auVar51._20_4_ = uStack_3ec;
      auVar51._24_4_ = uStack_3e8;
      auVar51._28_4_ = uStack_3e4;
      auVar88 = vminps_avx(auVar51,auVar204);
      auVar88 = vmaxps_avx(auVar88,ZEXT832(0) << 0x20);
      auVar35._4_4_ = (auVar179._4_4_ + 1.0) * 0.125;
      auVar35._0_4_ = (auVar179._0_4_ + 0.0) * 0.125;
      auVar35._8_4_ = (auVar179._8_4_ + 2.0) * 0.125;
      auVar35._12_4_ = (auVar179._12_4_ + 3.0) * 0.125;
      auVar35._16_4_ = (auVar179._16_4_ + 4.0) * 0.125;
      auVar35._20_4_ = (auVar179._20_4_ + 5.0) * 0.125;
      auVar35._24_4_ = (auVar179._24_4_ + 6.0) * 0.125;
      auVar35._28_4_ = auVar179._28_4_ + 7.0;
      auVar79 = vfmadd213ps_fma(auVar35,local_780,local_760);
      auVar36._4_4_ = (auVar88._4_4_ + 1.0) * 0.125;
      auVar36._0_4_ = (auVar88._0_4_ + 0.0) * 0.125;
      auVar36._8_4_ = (auVar88._8_4_ + 2.0) * 0.125;
      auVar36._12_4_ = (auVar88._12_4_ + 3.0) * 0.125;
      auVar36._16_4_ = (auVar88._16_4_ + 4.0) * 0.125;
      auVar36._20_4_ = (auVar88._20_4_ + 5.0) * 0.125;
      auVar36._24_4_ = (auVar88._24_4_ + 6.0) * 0.125;
      auVar36._28_4_ = auVar88._28_4_ + 7.0;
      auVar132 = vfmadd213ps_fma(auVar36,local_780,local_760);
      auVar179 = vminps_avx(auVar144,local_7a0);
      auVar88 = vminps_avx(auVar13,auVar14);
      auVar179 = vminps_avx(auVar179,auVar88);
      auVar236 = vsubps_avx(auVar179,auVar236);
      auVar84 = vandps_avx(auVar202,auVar84);
      local_1a0 = ZEXT1632(auVar79);
      local_1c0 = ZEXT1632(auVar132);
      auVar37._4_4_ = auVar236._4_4_ * 0.99999976;
      auVar37._0_4_ = auVar236._0_4_ * 0.99999976;
      auVar37._8_4_ = auVar236._8_4_ * 0.99999976;
      auVar37._12_4_ = auVar236._12_4_ * 0.99999976;
      auVar37._16_4_ = auVar236._16_4_ * 0.99999976;
      auVar37._20_4_ = auVar236._20_4_ * 0.99999976;
      auVar37._24_4_ = auVar236._24_4_ * 0.99999976;
      auVar37._28_4_ = auVar202._28_4_;
      auVar202 = vmaxps_avx(ZEXT832(0) << 0x20,auVar37);
      auVar38._4_4_ = auVar202._4_4_ * auVar202._4_4_;
      auVar38._0_4_ = auVar202._0_4_ * auVar202._0_4_;
      auVar38._8_4_ = auVar202._8_4_ * auVar202._8_4_;
      auVar38._12_4_ = auVar202._12_4_ * auVar202._12_4_;
      auVar38._16_4_ = auVar202._16_4_ * auVar202._16_4_;
      auVar38._20_4_ = auVar202._20_4_ * auVar202._20_4_;
      auVar38._24_4_ = auVar202._24_4_ * auVar202._24_4_;
      auVar38._28_4_ = auVar202._28_4_;
      auVar236 = vsubps_avx(auVar182,auVar38);
      auVar39._4_4_ = auVar236._4_4_ * fVar128 * 4.0;
      auVar39._0_4_ = auVar236._0_4_ * fVar97 * 4.0;
      auVar39._8_4_ = auVar236._8_4_ * fVar129 * 4.0;
      auVar39._12_4_ = auVar236._12_4_ * fVar197 * 4.0;
      auVar39._16_4_ = auVar236._16_4_ * fVar150 * 4.0;
      auVar39._20_4_ = auVar236._20_4_ * fVar151 * 4.0;
      auVar39._24_4_ = auVar236._24_4_ * fVar152 * 4.0;
      auVar39._28_4_ = auVar202._28_4_;
      auVar179 = vsubps_avx(auVar25,auVar39);
      local_8e0 = vcmpps_avx(auVar179,ZEXT832(0) << 0x20,5);
      auVar202 = local_8e0;
      if ((((((((local_8e0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (local_8e0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (local_8e0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(local_8e0 >> 0x7f,0) == '\0') &&
            (local_8e0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(local_8e0 >> 0xbf,0) == '\0') &&
          (local_8e0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < local_8e0[0x1f]) {
        auVar205 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar191 = ZEXT1228(ZEXT812(0)) << 0x20;
        auVar182 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar165 = ZEXT1232(ZEXT812(0)) << 0x20;
        _local_c00 = SUB3228(ZEXT832(0),0) << 0x20;
        auVar222._8_4_ = 0x7f800000;
        auVar222._0_8_ = 0x7f8000007f800000;
        auVar222._12_4_ = 0x7f800000;
        auVar222._16_4_ = 0x7f800000;
        auVar222._20_4_ = 0x7f800000;
        auVar222._24_4_ = 0x7f800000;
        auVar222._28_4_ = 0x7f800000;
        auVar241._8_4_ = 0xff800000;
        auVar241._0_8_ = 0xff800000ff800000;
        auVar241._12_4_ = 0xff800000;
        auVar241._16_4_ = 0xff800000;
        auVar241._20_4_ = 0xff800000;
        auVar241._24_4_ = 0xff800000;
        auVar241._28_4_ = 0xff800000;
        local_8e0 = auVar12;
      }
      else {
        auVar88 = vrcpps_avx(local_360);
        auVar167._8_4_ = 0x3f800000;
        auVar167._0_8_ = 0x3f8000003f800000;
        auVar167._12_4_ = 0x3f800000;
        auVar167._16_4_ = 0x3f800000;
        auVar167._20_4_ = 0x3f800000;
        auVar167._24_4_ = 0x3f800000;
        auVar167._28_4_ = 0x3f800000;
        auVar79 = vfnmadd213ps_fma(local_360,auVar88,auVar167);
        auVar79 = vfmadd132ps_fma(ZEXT1632(auVar79),auVar88,auVar88);
        auVar88 = vsqrtps_avx(auVar179);
        auVar168._0_8_ = local_340._0_8_ ^ 0x8000000080000000;
        auVar168._8_4_ = -local_340._8_4_;
        auVar168._12_4_ = -local_340._12_4_;
        auVar168._16_4_ = -local_340._16_4_;
        auVar168._20_4_ = -local_340._20_4_;
        auVar168._24_4_ = -local_340._24_4_;
        auVar168._28_4_ = -local_340._28_4_;
        auVar182 = vsubps_avx(auVar168,auVar88);
        auVar166 = vsubps_avx(auVar88,local_340);
        fVar97 = auVar182._0_4_ * auVar79._0_4_;
        fVar128 = auVar182._4_4_ * auVar79._4_4_;
        auVar40._4_4_ = fVar128;
        auVar40._0_4_ = fVar97;
        fVar129 = auVar182._8_4_ * auVar79._8_4_;
        auVar40._8_4_ = fVar129;
        fVar197 = auVar182._12_4_ * auVar79._12_4_;
        auVar40._12_4_ = fVar197;
        fVar206 = auVar182._16_4_ * 0.0;
        auVar40._16_4_ = fVar206;
        fVar207 = auVar182._20_4_ * 0.0;
        auVar40._20_4_ = fVar207;
        fVar208 = auVar182._24_4_ * 0.0;
        auVar40._24_4_ = fVar208;
        auVar40._28_4_ = auVar88._28_4_;
        fVar209 = auVar166._0_4_ * auVar79._0_4_;
        fVar210 = auVar166._4_4_ * auVar79._4_4_;
        auVar41._4_4_ = fVar210;
        auVar41._0_4_ = fVar209;
        fVar211 = auVar166._8_4_ * auVar79._8_4_;
        auVar41._8_4_ = fVar211;
        fVar171 = auVar166._12_4_ * auVar79._12_4_;
        auVar41._12_4_ = fVar171;
        fVar150 = auVar166._16_4_ * 0.0;
        auVar41._16_4_ = fVar150;
        fVar151 = auVar166._20_4_ * 0.0;
        auVar41._20_4_ = fVar151;
        fVar152 = auVar166._24_4_ * 0.0;
        auVar41._24_4_ = fVar152;
        auVar41._28_4_ = local_760._0_4_;
        auVar79 = vfmadd213ps_fma(auVar240,auVar40,auVar270);
        auVar132 = vfmadd213ps_fma(auVar240,auVar41,auVar270);
        auVar182 = ZEXT1632(CONCAT412(fVar130 * auVar79._12_4_,
                                      CONCAT48(fVar131 * auVar79._8_4_,
                                               CONCAT44(fVar127 * auVar79._4_4_,
                                                        fVar126 * auVar79._0_4_))));
        auVar88 = ZEXT1632(CONCAT412(auVar132._12_4_ * fVar130,
                                     CONCAT48(auVar132._8_4_ * fVar131,
                                              CONCAT44(auVar132._4_4_ * fVar127,
                                                       auVar132._0_4_ * fVar126))));
        auVar79 = vfmadd213ps_fma(local_2e0,auVar182,local_920);
        auVar132 = vfmadd213ps_fma(local_2e0,auVar88,local_920);
        auVar99 = vfmadd213ps_fma(local_300,auVar182,auVar228);
        auVar71 = vfmadd213ps_fma(local_300,auVar88,auVar228);
        auVar100 = vfmadd213ps_fma(auVar182,local_2c0,auVar85);
        auVar153 = vfmadd213ps_fma(local_2c0,auVar88,auVar85);
        auVar42._4_4_ = (float)local_640._4_4_ * fVar128;
        auVar42._0_4_ = (float)local_640._0_4_ * fVar97;
        auVar42._8_4_ = fStack_638 * fVar129;
        auVar42._12_4_ = fStack_634 * fVar197;
        auVar42._16_4_ = fStack_630 * fVar206;
        auVar42._20_4_ = fStack_62c * fVar207;
        auVar42._24_4_ = fStack_628 * fVar208;
        auVar42._28_4_ = 0;
        auVar182 = vsubps_avx(auVar42,ZEXT1632(auVar79));
        auVar196._0_4_ = (float)local_7c0._0_4_ * fVar97;
        auVar196._4_4_ = (float)local_7c0._4_4_ * fVar128;
        auVar196._8_4_ = fStack_7b8 * fVar129;
        auVar196._12_4_ = fStack_7b4 * fVar197;
        auVar196._16_4_ = fStack_7b0 * fVar206;
        auVar196._20_4_ = fStack_7ac * fVar207;
        auVar196._24_4_ = fStack_7a8 * fVar208;
        auVar196._28_4_ = 0;
        auVar165 = vsubps_avx(auVar196,ZEXT1632(auVar99));
        auVar43._4_4_ = (float)local_7e0._4_4_ * fVar128;
        auVar43._0_4_ = (float)local_7e0._0_4_ * fVar97;
        auVar43._8_4_ = fStack_7d8 * fVar129;
        auVar43._12_4_ = fStack_7d4 * fVar197;
        auVar43._16_4_ = fStack_7d0 * fVar206;
        auVar43._20_4_ = fStack_7cc * fVar207;
        auVar43._24_4_ = fStack_7c8 * fVar208;
        auVar43._28_4_ = 0;
        auVar88 = vsubps_avx(auVar43,ZEXT1632(auVar100));
        _local_c00 = auVar88._0_28_;
        auVar44._4_4_ = fVar210 * (float)local_640._4_4_;
        auVar44._0_4_ = fVar209 * (float)local_640._0_4_;
        auVar44._8_4_ = fVar211 * fStack_638;
        auVar44._12_4_ = fVar171 * fStack_634;
        auVar44._16_4_ = fVar150 * fStack_630;
        auVar44._20_4_ = fVar151 * fStack_62c;
        auVar44._24_4_ = fVar152 * fStack_628;
        auVar44._28_4_ = auVar88._28_4_;
        auVar166 = vsubps_avx(auVar44,ZEXT1632(auVar132));
        auVar45._4_4_ = (float)local_7c0._4_4_ * fVar210;
        auVar45._0_4_ = (float)local_7c0._0_4_ * fVar209;
        auVar45._8_4_ = fStack_7b8 * fVar211;
        auVar45._12_4_ = fStack_7b4 * fVar171;
        auVar45._16_4_ = fStack_7b0 * fVar150;
        auVar45._20_4_ = fStack_7ac * fVar151;
        auVar45._24_4_ = fStack_7a8 * fVar152;
        auVar45._28_4_ = 0;
        auVar205 = vsubps_avx(auVar45,ZEXT1632(auVar71));
        auVar46._4_4_ = (float)local_7e0._4_4_ * fVar210;
        auVar46._0_4_ = (float)local_7e0._0_4_ * fVar209;
        auVar46._8_4_ = fStack_7d8 * fVar211;
        auVar46._12_4_ = fStack_7d4 * fVar171;
        auVar46._16_4_ = fStack_7d0 * fVar150;
        auVar46._20_4_ = fStack_7cc * fVar151;
        auVar46._24_4_ = fStack_7c8 * fVar152;
        auVar46._28_4_ = 0;
        auVar88 = vsubps_avx(auVar46,ZEXT1632(auVar153));
        auVar191 = auVar88._0_28_;
        auVar88 = vcmpps_avx(auVar179,_DAT_01f7b000,5);
        auVar223._8_4_ = 0x7f800000;
        auVar223._0_8_ = 0x7f8000007f800000;
        auVar223._12_4_ = 0x7f800000;
        auVar223._16_4_ = 0x7f800000;
        auVar223._20_4_ = 0x7f800000;
        auVar223._24_4_ = 0x7f800000;
        auVar223._28_4_ = 0x7f800000;
        auVar222 = vblendvps_avx(auVar223,auVar40,auVar88);
        auVar179 = vandps_avx(local_800,local_320);
        auVar179 = vmaxps_avx(local_580,auVar179);
        auVar47._4_4_ = auVar179._4_4_ * 1.9073486e-06;
        auVar47._0_4_ = auVar179._0_4_ * 1.9073486e-06;
        auVar47._8_4_ = auVar179._8_4_ * 1.9073486e-06;
        auVar47._12_4_ = auVar179._12_4_ * 1.9073486e-06;
        auVar47._16_4_ = auVar179._16_4_ * 1.9073486e-06;
        auVar47._20_4_ = auVar179._20_4_ * 1.9073486e-06;
        auVar47._24_4_ = auVar179._24_4_ * 1.9073486e-06;
        auVar47._28_4_ = auVar179._28_4_;
        auVar179 = vandps_avx(local_800,auVar11);
        auVar179 = vcmpps_avx(auVar179,auVar47,1);
        auVar242._8_4_ = 0xff800000;
        auVar242._0_8_ = 0xff800000ff800000;
        auVar242._12_4_ = 0xff800000;
        auVar242._16_4_ = 0xff800000;
        auVar242._20_4_ = 0xff800000;
        auVar242._24_4_ = 0xff800000;
        auVar242._28_4_ = 0xff800000;
        auVar241 = vblendvps_avx(auVar242,auVar41,auVar88);
        auVar11 = auVar88 & auVar179;
        if ((((((((auVar11 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar11 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar11 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar11 >> 0x7f,0) != '\0') ||
              (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar11 >> 0xbf,0) != '\0') ||
            (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar11[0x1f] < '\0') {
          auVar202 = vandps_avx(auVar88,auVar179);
          auVar179 = vcmpps_avx(auVar236,ZEXT832(0) << 0x20,2);
          auVar238._8_4_ = 0xff800000;
          auVar238._0_8_ = 0xff800000ff800000;
          auVar238._12_4_ = 0xff800000;
          auVar238._16_4_ = 0xff800000;
          auVar238._20_4_ = 0xff800000;
          auVar238._24_4_ = 0xff800000;
          auVar238._28_4_ = 0xff800000;
          auVar125._8_4_ = 0x7f800000;
          auVar125._0_8_ = 0x7f8000007f800000;
          auVar125._12_4_ = 0x7f800000;
          auVar125._16_4_ = 0x7f800000;
          auVar125._20_4_ = 0x7f800000;
          auVar125._24_4_ = 0x7f800000;
          auVar125._28_4_ = 0x7f800000;
          auVar236 = vblendvps_avx(auVar125,auVar238,auVar179);
          auVar79 = vpackssdw_avx(auVar202._0_16_,auVar202._16_16_);
          auVar11 = vpmovsxwd_avx2(auVar79);
          auVar222 = vblendvps_avx(auVar222,auVar236,auVar11);
          auVar236 = vblendvps_avx(auVar238,auVar125,auVar179);
          auVar241 = vblendvps_avx(auVar241,auVar236,auVar11);
          auVar149._0_8_ = auVar202._0_8_ ^ 0xffffffffffffffff;
          auVar149._8_4_ = auVar202._8_4_ ^ 0xffffffff;
          auVar149._12_4_ = auVar202._12_4_ ^ 0xffffffff;
          auVar149._16_4_ = auVar202._16_4_ ^ 0xffffffff;
          auVar149._20_4_ = auVar202._20_4_ ^ 0xffffffff;
          auVar149._24_4_ = auVar202._24_4_ ^ 0xffffffff;
          auVar149._28_4_ = auVar202._28_4_ ^ 0xffffffff;
          auVar202 = vorps_avx(auVar179,auVar149);
          auVar202 = vandps_avx(auVar88,auVar202);
        }
      }
      local_4a0 = auVar10;
      local_480 = vminps_avx(local_440,auVar222);
      _local_840 = vmaxps_avx(auVar10,auVar241);
      _local_460 = _local_840;
      auVar236 = vcmpps_avx(auVar10,local_480,2);
      local_5c0 = vandps_avx(auVar84,auVar236);
      auVar236 = vcmpps_avx(_local_840,local_440,2);
      _local_a20 = vandps_avx(auVar84,auVar236);
      auVar243 = ZEXT3264(_local_a20);
      auVar84 = vorps_avx(_local_a20,local_5c0);
      if ((((((((auVar84 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar84 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar84 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar84 >> 0x7f,0) == '\0') &&
            (auVar84 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar84 >> 0xbf,0) == '\0') &&
          (auVar84 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar84[0x1f])
      {
        auVar250 = ZEXT3264(CONCAT824(uStack_928,
                                      CONCAT816(uStack_930,CONCAT88(uStack_938,local_940))));
        goto LAB_01195fe4;
      }
      auVar48._4_4_ = (float)local_7e0._4_4_ * auVar191._4_4_;
      auVar48._0_4_ = (float)local_7e0._0_4_ * auVar191._0_4_;
      auVar48._8_4_ = fStack_7d8 * auVar191._8_4_;
      auVar48._12_4_ = fStack_7d4 * auVar191._12_4_;
      auVar48._16_4_ = fStack_7d0 * auVar191._16_4_;
      auVar48._20_4_ = fStack_7cc * auVar191._20_4_;
      auVar48._24_4_ = fStack_7c8 * auVar191._24_4_;
      auVar48._28_4_ = auVar84._28_4_;
      auVar79 = vfmadd213ps_fma(auVar205,_local_7c0,auVar48);
      auVar79 = vfmadd213ps_fma(auVar166,_local_640,ZEXT1632(auVar79));
      auVar91._0_8_ = auVar202._0_8_ ^ 0xffffffffffffffff;
      auVar91._8_4_ = auVar202._8_4_ ^ 0xffffffff;
      auVar91._12_4_ = auVar202._12_4_ ^ 0xffffffff;
      auVar91._16_4_ = auVar202._16_4_ ^ 0xffffffff;
      auVar91._20_4_ = auVar202._20_4_ ^ 0xffffffff;
      auVar91._24_4_ = auVar202._24_4_ ^ 0xffffffff;
      auVar91._28_4_ = auVar202._28_4_ ^ 0xffffffff;
      auVar84 = vandps_avx(ZEXT1632(auVar79),local_800);
      auVar146._8_4_ = 0x3e99999a;
      auVar146._0_8_ = 0x3e99999a3e99999a;
      auVar146._12_4_ = 0x3e99999a;
      auVar146._16_4_ = 0x3e99999a;
      auVar146._20_4_ = 0x3e99999a;
      auVar146._24_4_ = 0x3e99999a;
      auVar146._28_4_ = 0x3e99999a;
      auVar84 = vcmpps_avx(auVar84,auVar146,1);
      local_600 = vorps_avx(auVar84,auVar91);
      auVar49._4_4_ = (float)local_7e0._4_4_ * (float)local_c00._4_4_;
      auVar49._0_4_ = (float)local_7e0._0_4_ * (float)local_c00._0_4_;
      auVar49._8_4_ = fStack_7d8 * fStack_bf8;
      auVar49._12_4_ = fStack_7d4 * fStack_bf4;
      auVar49._16_4_ = fStack_7d0 * fStack_bf0;
      auVar49._20_4_ = fStack_7cc * fStack_bec;
      auVar49._24_4_ = fStack_7c8 * fStack_be8;
      auVar49._28_4_ = local_600._28_4_;
      auVar79 = vfmadd213ps_fma(auVar165,_local_7c0,auVar49);
      auVar79 = vfmadd213ps_fma(auVar182,_local_640,ZEXT1632(auVar79));
      auVar84 = vandps_avx(ZEXT1632(auVar79),local_800);
      auVar84 = vcmpps_avx(auVar84,auVar146,1);
      auVar84 = vorps_avx(auVar84,auVar91);
      auVar119._8_4_ = 3;
      auVar119._0_8_ = 0x300000003;
      auVar119._12_4_ = 3;
      auVar119._16_4_ = 3;
      auVar119._20_4_ = 3;
      auVar119._24_4_ = 3;
      auVar119._28_4_ = 3;
      auVar147._8_4_ = 2;
      auVar147._0_8_ = 0x200000002;
      auVar147._12_4_ = 2;
      auVar147._16_4_ = 2;
      auVar147._20_4_ = 2;
      auVar147._24_4_ = 2;
      auVar147._28_4_ = 2;
      auVar84 = vblendvps_avx(auVar147,auVar119,auVar84);
      local_620._4_4_ = local_c04;
      local_620._0_4_ = local_c04;
      local_620._8_4_ = local_c04;
      local_620._12_4_ = local_c04;
      local_620._16_4_ = local_c04;
      local_620._20_4_ = local_c04;
      local_620._24_4_ = local_c04;
      local_620._28_4_ = local_c04;
      local_5e0 = vpcmpgtd_avx2(auVar84,local_620);
      local_4c0 = vpandn_avx2(local_5e0,local_5c0);
      local_820._4_4_ = auVar10._4_4_ + (float)local_880._4_4_;
      local_820._0_4_ = auVar10._0_4_ + (float)local_880._0_4_;
      fStack_818 = auVar10._8_4_ + fStack_878;
      fStack_814 = auVar10._12_4_ + fStack_874;
      fStack_810 = auVar10._16_4_ + fStack_870;
      fStack_80c = auVar10._20_4_ + fStack_86c;
      fStack_808 = auVar10._24_4_ + fStack_868;
      fStack_804 = auVar10._28_4_ + fStack_864;
      auVar225 = ZEXT3264(_local_a20);
      while( true ) {
        auVar84 = _local_460;
        fStack_adc = auVar7._4_4_;
        fStack_ad8 = auVar7._8_4_;
        fStack_ad4 = auVar7._12_4_;
        if ((((((((local_4c0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_4c0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_4c0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_4c0 >> 0x7f,0) == '\0') &&
              (local_4c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_4c0 >> 0xbf,0) == '\0') &&
            (local_4c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_4c0[0x1f]) break;
        auVar120._8_4_ = 0x7f800000;
        auVar120._0_8_ = 0x7f8000007f800000;
        auVar120._12_4_ = 0x7f800000;
        auVar120._16_4_ = 0x7f800000;
        auVar120._20_4_ = 0x7f800000;
        auVar120._24_4_ = 0x7f800000;
        auVar120._28_4_ = 0x7f800000;
        auVar84 = vblendvps_avx(auVar120,auVar10,local_4c0);
        auVar202 = vshufps_avx(auVar84,auVar84,0xb1);
        auVar202 = vminps_avx(auVar84,auVar202);
        auVar236 = vshufpd_avx(auVar202,auVar202,5);
        auVar202 = vminps_avx(auVar202,auVar236);
        auVar236 = vpermpd_avx2(auVar202,0x4e);
        auVar202 = vminps_avx(auVar202,auVar236);
        auVar202 = vcmpps_avx(auVar84,auVar202,0);
        auVar236 = local_4c0 & auVar202;
        auVar84 = local_4c0;
        if ((((((((auVar236 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar236 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar236 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar236 >> 0x7f,0) != '\0') ||
              (auVar236 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar236 >> 0xbf,0) != '\0') ||
            (auVar236 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar236[0x1f] < '\0') {
          auVar84 = vandps_avx(auVar202,local_4c0);
        }
        uVar57 = vmovmskps_avx(auVar84);
        iVar15 = 0;
        for (; (uVar57 & 1) == 0; uVar57 = uVar57 >> 1 | 0x80000000) {
          iVar15 = iVar15 + 1;
        }
        uVar63 = (ulong)(uint)(iVar15 << 2);
        *(undefined4 *)(local_4c0 + uVar63) = 0;
        uVar57 = *(uint *)(local_1a0 + uVar63);
        uVar61 = *(uint *)(local_4a0 + uVar63);
        fVar97 = auVar4._0_4_;
        if ((float)local_960._0_4_ < 0.0) {
          auVar243 = ZEXT1664(auVar243._0_16_);
          fVar97 = sqrtf((float)local_960._0_4_);
          uVar63 = extraout_RAX;
        }
        auVar132 = vminps_avx(auVar8,auVar72);
        auVar79 = vmaxps_avx(auVar8,auVar72);
        auVar99 = vminps_avx(auVar73,auVar7);
        auVar71 = vminps_avx(auVar132,auVar99);
        auVar132 = vmaxps_avx(auVar73,auVar7);
        auVar99 = vmaxps_avx(auVar79,auVar132);
        auVar79 = vandps_avx(auVar71,auVar226);
        auVar132 = vandps_avx(auVar99,auVar226);
        auVar79 = vmaxps_avx(auVar79,auVar132);
        auVar132 = vmovshdup_avx(auVar79);
        auVar132 = vmaxss_avx(auVar132,auVar79);
        auVar79 = vshufpd_avx(auVar79,auVar79,1);
        auVar79 = vmaxss_avx(auVar79,auVar132);
        local_920._0_4_ = auVar79._0_4_ * 1.9073486e-06;
        local_980._0_4_ = fVar97 * 1.9073486e-06;
        local_7a0._0_16_ = vshufps_avx(auVar99,auVar99,0xff);
        auVar79 = vinsertps_avx(ZEXT416(uVar61),ZEXT416(uVar57),0x10);
        for (uVar65 = 0; bVar67 = (byte)uVar63, uVar65 != 5; uVar65 = uVar65 + 1) {
          auVar99 = vmovshdup_avx(auVar79);
          fVar131 = 1.0 - auVar99._0_4_;
          auVar132 = vshufps_avx(auVar79,auVar79,0x55);
          fVar97 = auVar132._0_4_;
          auVar101._0_4_ = fVar94 * fVar97;
          fVar126 = auVar132._4_4_;
          auVar101._4_4_ = auVar72._4_4_ * fVar126;
          fVar127 = auVar132._8_4_;
          auVar101._8_4_ = auVar72._8_4_ * fVar127;
          fVar128 = auVar132._12_4_;
          auVar101._12_4_ = auVar72._12_4_ * fVar128;
          auVar133._4_4_ = fVar131;
          auVar133._0_4_ = fVar131;
          auVar133._8_4_ = fVar131;
          auVar133._12_4_ = fVar131;
          auVar132 = vfmadd231ps_fma(auVar101,auVar133,auVar8);
          auVar154._0_4_ = fVar96 * fVar97;
          auVar154._4_4_ = auVar73._4_4_ * fVar126;
          auVar154._8_4_ = auVar73._8_4_ * fVar127;
          auVar154._12_4_ = auVar73._12_4_ * fVar128;
          auVar71 = vfmadd231ps_fma(auVar154,auVar133,auVar72);
          auVar187._0_4_ = fVar97 * auVar71._0_4_;
          auVar187._4_4_ = fVar126 * auVar71._4_4_;
          auVar187._8_4_ = fVar127 * auVar71._8_4_;
          auVar187._12_4_ = fVar128 * auVar71._12_4_;
          auVar100 = vfmadd231ps_fma(auVar187,auVar133,auVar132);
          auVar102._0_4_ = fVar97 * fVar95;
          auVar102._4_4_ = fVar126 * fStack_adc;
          auVar102._8_4_ = fVar127 * fStack_ad8;
          auVar102._12_4_ = fVar128 * fStack_ad4;
          auVar132 = vfmadd231ps_fma(auVar102,auVar133,auVar73);
          auVar173._0_4_ = fVar97 * auVar132._0_4_;
          auVar173._4_4_ = fVar126 * auVar132._4_4_;
          auVar173._8_4_ = fVar127 * auVar132._8_4_;
          auVar173._12_4_ = fVar128 * auVar132._12_4_;
          auVar153 = vfmadd231ps_fma(auVar173,auVar133,auVar71);
          fVar129 = auVar79._0_4_;
          auVar103._4_4_ = fVar129;
          auVar103._0_4_ = fVar129;
          auVar103._8_4_ = fVar129;
          auVar103._12_4_ = fVar129;
          auVar132 = vfmadd213ps_fma(auVar103,local_950,_DAT_01f45a50);
          auVar75._0_4_ = fVar97 * auVar153._0_4_;
          auVar75._4_4_ = fVar126 * auVar153._4_4_;
          auVar75._8_4_ = fVar127 * auVar153._8_4_;
          auVar75._12_4_ = fVar128 * auVar153._12_4_;
          auVar71 = vfmadd231ps_fma(auVar75,auVar100,auVar133);
          local_8e0._0_16_ = auVar71;
          auVar71 = vsubps_avx(auVar132,auVar71);
          auVar132 = vdpps_avx(auVar71,auVar71,0x7f);
          fVar97 = auVar132._0_4_;
          if (fVar97 < 0.0) {
            local_9c0._0_16_ = auVar100;
            auVar260._0_4_ = sqrtf(fVar97);
            auVar260._4_60_ = extraout_var;
            auVar76 = auVar260._0_16_;
            uVar63 = extraout_RAX_00;
            auVar100 = local_9c0._0_16_;
          }
          else {
            auVar76 = vsqrtss_avx(auVar132,auVar132);
          }
          auVar100 = vsubps_avx(auVar153,auVar100);
          auVar214._0_4_ = auVar100._0_4_ * 3.0;
          auVar214._4_4_ = auVar100._4_4_ * 3.0;
          auVar214._8_4_ = auVar100._8_4_ * 3.0;
          auVar214._12_4_ = auVar100._12_4_ * 3.0;
          auVar100 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),ZEXT416((uint)fVar131),auVar99);
          auVar153 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar99,ZEXT416((uint)fVar131));
          fVar131 = fVar131 * 6.0;
          fVar126 = auVar100._0_4_ * 6.0;
          fVar127 = auVar153._0_4_ * 6.0;
          fVar128 = auVar99._0_4_ * 6.0;
          auVar155._0_4_ = fVar128 * fVar95;
          auVar155._4_4_ = fVar128 * fStack_adc;
          auVar155._8_4_ = fVar128 * fStack_ad8;
          auVar155._12_4_ = fVar128 * fStack_ad4;
          auVar104._4_4_ = fVar127;
          auVar104._0_4_ = fVar127;
          auVar104._8_4_ = fVar127;
          auVar104._12_4_ = fVar127;
          auVar99 = vfmadd132ps_fma(auVar104,auVar155,auVar73);
          auVar156._4_4_ = fVar126;
          auVar156._0_4_ = fVar126;
          auVar156._8_4_ = fVar126;
          auVar156._12_4_ = fVar126;
          auVar99 = vfmadd132ps_fma(auVar156,auVar99,auVar72);
          auVar100 = vdpps_avx(auVar214,auVar214,0x7f);
          auVar105._4_4_ = fVar131;
          auVar105._0_4_ = fVar131;
          auVar105._8_4_ = fVar131;
          auVar105._12_4_ = fVar131;
          auVar70 = vfmadd132ps_fma(auVar105,auVar99,auVar8);
          auVar99 = vblendps_avx(auVar100,_DAT_01f45a50,0xe);
          auVar153 = vrsqrtss_avx(auVar99,auVar99);
          fVar128 = auVar100._0_4_;
          fVar126 = auVar153._0_4_;
          auVar153 = vdpps_avx(auVar214,auVar70,0x7f);
          fVar126 = fVar126 * 1.5 + fVar128 * -0.5 * fVar126 * fVar126 * fVar126;
          auVar106._0_4_ = auVar70._0_4_ * fVar128;
          auVar106._4_4_ = auVar70._4_4_ * fVar128;
          auVar106._8_4_ = auVar70._8_4_ * fVar128;
          auVar106._12_4_ = auVar70._12_4_ * fVar128;
          fVar127 = auVar153._0_4_;
          auVar188._0_4_ = auVar214._0_4_ * fVar127;
          auVar188._4_4_ = auVar214._4_4_ * fVar127;
          auVar188._8_4_ = auVar214._8_4_ * fVar127;
          auVar188._12_4_ = auVar214._12_4_ * fVar127;
          auVar153 = vsubps_avx(auVar106,auVar188);
          auVar99 = vrcpss_avx(auVar99,auVar99);
          auVar70 = vfnmadd213ss_fma(auVar99,auVar100,ZEXT416(0x40000000));
          fVar127 = auVar99._0_4_ * auVar70._0_4_;
          auVar99 = vmaxss_avx(ZEXT416((uint)local_920._0_4_),
                               ZEXT416((uint)(fVar129 * (float)local_980._0_4_)));
          auVar225 = ZEXT1664(auVar99);
          uVar50 = CONCAT44(auVar214._4_4_,auVar214._0_4_);
          auVar200._0_8_ = uVar50 ^ 0x8000000080000000;
          auVar200._8_4_ = -auVar214._8_4_;
          auVar200._12_4_ = -auVar214._12_4_;
          auVar157._0_4_ = fVar126 * auVar153._0_4_ * fVar127;
          auVar157._4_4_ = fVar126 * auVar153._4_4_ * fVar127;
          auVar157._8_4_ = fVar126 * auVar153._8_4_ * fVar127;
          auVar157._12_4_ = fVar126 * auVar153._12_4_ * fVar127;
          auVar248._0_4_ = auVar214._0_4_ * fVar126;
          auVar248._4_4_ = auVar214._4_4_ * fVar126;
          auVar248._8_4_ = auVar214._8_4_ * fVar126;
          auVar248._12_4_ = auVar214._12_4_ * fVar126;
          if (fVar128 < -fVar128) {
            local_9c0._0_4_ = auVar76._0_4_;
            local_9e0._0_16_ = auVar248;
            local_a00._0_16_ = auVar157;
            fVar126 = sqrtf(fVar128);
            auVar76 = ZEXT416((uint)local_9c0._0_4_);
            auVar225 = ZEXT464(auVar99._0_4_);
            uVar63 = extraout_RAX_01;
            auVar157 = local_a00._0_16_;
            auVar248 = local_9e0._0_16_;
          }
          else {
            auVar100 = vsqrtss_avx(auVar100,auVar100);
            fVar126 = auVar100._0_4_;
          }
          auVar100 = vdpps_avx(auVar71,auVar248,0x7f);
          auVar172 = vfmadd213ss_fma(ZEXT416((uint)local_920._0_4_),auVar76,auVar225._0_16_);
          auVar153 = vdpps_avx(auVar200,auVar248,0x7f);
          auVar70 = vdpps_avx(auVar71,auVar157,0x7f);
          auVar98 = vdpps_avx(local_950,auVar248,0x7f);
          auVar172 = vfmadd213ss_fma(ZEXT416((uint)(auVar76._0_4_ + 1.0)),
                                     ZEXT416((uint)((float)local_920._0_4_ / fVar126)),auVar172);
          fVar126 = auVar153._0_4_ + auVar70._0_4_;
          auVar77._0_4_ = auVar100._0_4_ * auVar100._0_4_;
          auVar77._4_4_ = auVar100._4_4_ * auVar100._4_4_;
          auVar77._8_4_ = auVar100._8_4_ * auVar100._8_4_;
          auVar77._12_4_ = auVar100._12_4_ * auVar100._12_4_;
          auVar153 = vdpps_avx(auVar71,auVar200,0x7f);
          auVar70 = vsubps_avx(auVar132,auVar77);
          auVar76 = vrsqrtss_avx(auVar70,auVar70);
          fVar128 = auVar70._0_4_;
          fVar127 = auVar76._0_4_;
          fVar127 = fVar127 * 1.5 + fVar128 * -0.5 * fVar127 * fVar127 * fVar127;
          auVar76 = vdpps_avx(auVar71,local_950,0x7f);
          auVar153 = vfnmadd231ss_fma(auVar153,auVar100,ZEXT416((uint)fVar126));
          auVar76 = vfnmadd231ss_fma(auVar76,auVar100,auVar98);
          if (fVar128 < 0.0) {
            local_9c0._0_16_ = auVar100;
            local_9e0._0_16_ = ZEXT416((uint)fVar126);
            local_a00._0_16_ = auVar98;
            local_740._0_16_ = auVar153;
            local_760._0_4_ = fVar127;
            local_780._0_16_ = auVar76;
            fVar128 = sqrtf(fVar128);
            auVar225 = ZEXT464(auVar99._0_4_);
            uVar63 = extraout_RAX_02;
            fVar127 = (float)local_760._0_4_;
            auVar76 = local_780._0_16_;
            auVar153 = local_740._0_16_;
            auVar100 = local_9c0._0_16_;
            auVar98 = local_a00._0_16_;
            auVar99 = local_9e0._0_16_;
          }
          else {
            auVar99 = vsqrtss_avx(auVar70,auVar70);
            fVar128 = auVar99._0_4_;
            auVar99 = ZEXT416((uint)fVar126);
          }
          auVar243 = ZEXT1664(auVar100);
          auVar70 = vpermilps_avx(local_8e0._0_16_,0xff);
          fVar128 = fVar128 - auVar70._0_4_;
          auVar70 = vshufps_avx(auVar214,auVar214,0xff);
          auVar153 = vfmsub213ss_fma(auVar153,ZEXT416((uint)fVar127),auVar70);
          auVar158._0_8_ = auVar98._0_8_ ^ 0x8000000080000000;
          auVar158._8_4_ = auVar98._8_4_ ^ 0x80000000;
          auVar158._12_4_ = auVar98._12_4_ ^ 0x80000000;
          auVar174._0_8_ = auVar153._0_8_ ^ 0x8000000080000000;
          auVar174._8_4_ = auVar153._8_4_ ^ 0x80000000;
          auVar174._12_4_ = auVar153._12_4_ ^ 0x80000000;
          auVar134 = ZEXT416((uint)(auVar76._0_4_ * fVar127));
          auVar76 = vfmsub231ss_fma(ZEXT416((uint)(auVar98._0_4_ * auVar153._0_4_)),auVar99,auVar134
                                   );
          auVar153 = vinsertps_avx(auVar174,auVar134,0x1c);
          uVar64 = auVar76._0_4_;
          auVar175._4_4_ = uVar64;
          auVar175._0_4_ = uVar64;
          auVar175._8_4_ = uVar64;
          auVar175._12_4_ = uVar64;
          auVar153 = vdivps_avx(auVar153,auVar175);
          auVar99 = vinsertps_avx(auVar99,auVar158,0x10);
          auVar99 = vdivps_avx(auVar99,auVar175);
          fVar126 = auVar100._0_4_;
          auVar135._0_4_ = fVar126 * auVar153._0_4_ + fVar128 * auVar99._0_4_;
          auVar135._4_4_ = fVar126 * auVar153._4_4_ + fVar128 * auVar99._4_4_;
          auVar135._8_4_ = fVar126 * auVar153._8_4_ + fVar128 * auVar99._8_4_;
          auVar135._12_4_ = fVar126 * auVar153._12_4_ + fVar128 * auVar99._12_4_;
          auVar79 = vsubps_avx(auVar79,auVar135);
          auVar99 = vandps_avx(auVar100,auVar226);
          if (auVar99._0_4_ < auVar172._0_4_) {
            auVar153 = vfmadd231ss_fma(ZEXT416((uint)(auVar225._0_4_ + auVar172._0_4_)),
                                       local_7a0._0_16_,ZEXT416(0x36000000));
            auVar99 = vandps_avx(ZEXT416((uint)fVar128),auVar226);
            if (auVar99._0_4_ < auVar153._0_4_) {
              bVar66 = uVar65 < 5;
              fVar126 = auVar79._0_4_ + (float)local_8c0._0_4_;
              if (fVar126 < fVar68) {
                bVar67 = 0;
                goto LAB_01196822;
              }
              fVar127 = *(float *)(ray + k * 4 + 0x80);
              auVar225 = ZEXT3264(_local_a20);
              if (fVar126 <= fVar127) {
                auVar99 = vmovshdup_avx(auVar79);
                bVar67 = 0;
                if ((auVar99._0_4_ < 0.0) || (bVar67 = 0, 1.0 < auVar99._0_4_)) goto LAB_01196834;
                auVar132 = vrsqrtss_avx(auVar132,auVar132);
                fVar128 = auVar132._0_4_;
                pGVar2 = (context->scene->geometries).items[uVar58].ptr;
                if ((pGVar2->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (bVar67 = 1, pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    fVar97 = fVar128 * 1.5 + fVar97 * -0.5 * fVar128 * fVar128 * fVar128;
                    local_aa0 = auVar71._0_4_;
                    fStack_a9c = auVar71._4_4_;
                    fStack_a98 = auVar71._8_4_;
                    fStack_a94 = auVar71._12_4_;
                    auVar136._0_4_ = fVar97 * local_aa0;
                    auVar136._4_4_ = fVar97 * fStack_a9c;
                    auVar136._8_4_ = fVar97 * fStack_a98;
                    auVar136._12_4_ = fVar97 * fStack_a94;
                    auVar153 = vfmadd213ps_fma(auVar70,auVar136,auVar214);
                    auVar132 = vshufps_avx(auVar136,auVar136,0xc9);
                    auVar99 = vshufps_avx(auVar214,auVar214,0xc9);
                    auVar137._0_4_ = auVar136._0_4_ * auVar99._0_4_;
                    auVar137._4_4_ = auVar136._4_4_ * auVar99._4_4_;
                    auVar137._8_4_ = auVar136._8_4_ * auVar99._8_4_;
                    auVar137._12_4_ = auVar136._12_4_ * auVar99._12_4_;
                    auVar71 = vfmsub231ps_fma(auVar137,auVar214,auVar132);
                    auVar132 = vshufps_avx(auVar71,auVar71,0xc9);
                    auVar99 = vshufps_avx(auVar153,auVar153,0xc9);
                    auVar71 = vshufps_avx(auVar71,auVar71,0xd2);
                    auVar78._0_4_ = auVar153._0_4_ * auVar71._0_4_;
                    auVar78._4_4_ = auVar153._4_4_ * auVar71._4_4_;
                    auVar78._8_4_ = auVar153._8_4_ * auVar71._8_4_;
                    auVar78._12_4_ = auVar153._12_4_ * auVar71._12_4_;
                    auVar132 = vfmsub231ps_fma(auVar78,auVar132,auVar99);
                    local_6d0 = vshufps_avx(auVar79,auVar79,0x55);
                    local_700 = (RTCHitN  [16])vshufps_avx(auVar132,auVar132,0x55);
                    auStack_6f0 = vshufps_avx(auVar132,auVar132,0xaa);
                    local_6e0 = auVar132._0_4_;
                    local_6c0 = ZEXT416(0) << 0x20;
                    local_6b0 = CONCAT44(uStack_71c,local_720);
                    uStack_6a8 = CONCAT44(uStack_714,uStack_718);
                    local_6a0._4_4_ = uStack_70c;
                    local_6a0._0_4_ = local_710;
                    local_6a0._8_4_ = uStack_708;
                    local_6a0._12_4_ = uStack_704;
                    vpcmpeqd_avx2(ZEXT1632(local_6a0),ZEXT1632(local_6a0));
                    uStack_68c = context->user->instID[0];
                    local_690 = uStack_68c;
                    uStack_688 = uStack_68c;
                    uStack_684 = uStack_68c;
                    uStack_680 = context->user->instPrimID[0];
                    uStack_67c = uStack_680;
                    uStack_678 = uStack_680;
                    uStack_674 = uStack_680;
                    *(float *)(ray + k * 4 + 0x80) = fVar126;
                    auVar79 = *(undefined1 (*) [16])
                               (mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
                    local_860._0_16_ = auVar79;
                    local_a50.valid = (int *)local_860;
                    local_a50.geometryUserPtr = pGVar2->userPtr;
                    local_a50.context = context->user;
                    local_a50.hit = local_700;
                    local_a50.N = 4;
                    local_a50.ray = (RTCRayN *)ray;
                    uStack_6dc = local_6e0;
                    uStack_6d8 = local_6e0;
                    uStack_6d4 = local_6e0;
                    if (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar243 = ZEXT1664(auVar100);
                      (*pGVar2->occlusionFilterN)(&local_a50);
                      auVar225 = ZEXT3264(_local_a20);
                      auVar79 = local_860._0_16_;
                    }
                    if (auVar79 == (undefined1  [16])0x0) {
                      auVar79 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                      auVar79 = auVar79 ^ _DAT_01f46b70;
                    }
                    else {
                      p_Var3 = context->args->filter;
                      if ((p_Var3 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar2->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar243 = ZEXT1664(auVar243._0_16_);
                        (*p_Var3)(&local_a50);
                        auVar225 = ZEXT3264(_local_a20);
                        auVar79 = local_860._0_16_;
                      }
                      auVar132 = vpcmpeqd_avx(auVar79,_DAT_01f45a50);
                      auVar79 = auVar132 ^ _DAT_01f46b70;
                      auVar138._8_4_ = 0xff800000;
                      auVar138._0_8_ = 0xff800000ff800000;
                      auVar138._12_4_ = 0xff800000;
                      auVar132 = vblendvps_avx(auVar138,*(undefined1 (*) [16])(local_a50.ray + 0x80)
                                               ,auVar132);
                      *(undefined1 (*) [16])(local_a50.ray + 0x80) = auVar132;
                    }
                    auVar107._8_8_ = 0x100000001;
                    auVar107._0_8_ = 0x100000001;
                    bVar67 = (auVar107 & auVar79) != (undefined1  [16])0x0;
                    if (!(bool)bVar67) {
                      *(float *)(ray + k * 4 + 0x80) = fVar127;
                    }
                  }
                  goto LAB_01196834;
                }
              }
              bVar67 = 0;
              goto LAB_01196834;
            }
          }
        }
        bVar66 = false;
LAB_01196822:
        auVar225 = ZEXT3264(_local_a20);
LAB_01196834:
        uVar64 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar231._4_4_ = uVar64;
        auVar231._0_4_ = uVar64;
        auVar231._8_4_ = uVar64;
        auVar231._12_4_ = uVar64;
        auVar231._16_4_ = uVar64;
        auVar231._20_4_ = uVar64;
        auVar231._24_4_ = uVar64;
        auVar231._28_4_ = uVar64;
        auVar233 = ZEXT3264(auVar231);
        bVar62 = bVar62 | bVar66 & bVar67;
        auVar84 = vcmpps_avx(_local_820,auVar231,2);
        local_4c0 = vandps_avx(auVar84,local_4c0);
      }
      auVar92._0_4_ = (float)local_880._0_4_ + (float)local_840._0_4_;
      auVar92._4_4_ = (float)local_880._4_4_ + (float)local_840._4_4_;
      auVar92._8_4_ = fStack_878 + fStack_838;
      auVar92._12_4_ = fStack_874 + fStack_834;
      auVar92._16_4_ = fStack_870 + fStack_830;
      auVar92._20_4_ = fStack_86c + fStack_82c;
      auVar92._24_4_ = fStack_868 + fStack_828;
      auVar92._28_4_ = fStack_864 + fStack_824;
      uVar64 = auVar233._0_4_;
      auVar121._4_4_ = uVar64;
      auVar121._0_4_ = uVar64;
      auVar121._8_4_ = uVar64;
      auVar121._12_4_ = uVar64;
      auVar121._16_4_ = uVar64;
      auVar121._20_4_ = uVar64;
      auVar121._24_4_ = uVar64;
      auVar121._28_4_ = uVar64;
      auVar202 = vcmpps_avx(auVar92,auVar121,2);
      _local_820 = vandps_avx(auVar202,auVar225._0_32_);
      auVar93._8_4_ = 3;
      auVar93._0_8_ = 0x300000003;
      auVar93._12_4_ = 3;
      auVar93._16_4_ = 3;
      auVar93._20_4_ = 3;
      auVar93._24_4_ = 3;
      auVar93._28_4_ = 3;
      auVar122._8_4_ = 2;
      auVar122._0_8_ = 0x200000002;
      auVar122._12_4_ = 2;
      auVar122._16_4_ = 2;
      auVar122._20_4_ = 2;
      auVar122._24_4_ = 2;
      auVar122._28_4_ = 2;
      auVar202 = vblendvps_avx(auVar122,auVar93,local_600);
      _local_840 = vpcmpgtd_avx2(auVar202,local_620);
      local_860 = vpandn_avx2(_local_840,_local_820);
      local_a20._4_4_ = (float)local_880._4_4_ + (float)local_460._4_4_;
      local_a20._0_4_ = (float)local_880._0_4_ + (float)local_460._0_4_;
      fStack_a18 = fStack_878 + fStack_458;
      fStack_a14 = fStack_874 + fStack_454;
      fStack_a10 = fStack_870 + fStack_450;
      fStack_a0c = fStack_86c + fStack_44c;
      fStack_a08 = fStack_868 + fStack_448;
      fStack_a04 = fStack_864 + fStack_444;
      auVar271 = ZEXT3264(local_9a0);
      for (; (((((((local_860 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                  (local_860 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (local_860 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                SUB321(local_860 >> 0x7f,0) != '\0') ||
               (local_860 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              SUB321(local_860 >> 0xbf,0) != '\0') ||
             (local_860 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             local_860[0x1f] < '\0'; local_860 = vandps_avx(auVar202,local_860)) {
        auVar123._8_4_ = 0x7f800000;
        auVar123._0_8_ = 0x7f8000007f800000;
        auVar123._12_4_ = 0x7f800000;
        auVar123._16_4_ = 0x7f800000;
        auVar123._20_4_ = 0x7f800000;
        auVar123._24_4_ = 0x7f800000;
        auVar123._28_4_ = 0x7f800000;
        auVar202 = vblendvps_avx(auVar123,auVar84,local_860);
        auVar236 = vshufps_avx(auVar202,auVar202,0xb1);
        auVar236 = vminps_avx(auVar202,auVar236);
        auVar179 = vshufpd_avx(auVar236,auVar236,5);
        auVar236 = vminps_avx(auVar236,auVar179);
        auVar179 = vpermpd_avx2(auVar236,0x4e);
        auVar236 = vminps_avx(auVar236,auVar179);
        auVar236 = vcmpps_avx(auVar202,auVar236,0);
        auVar179 = local_860 & auVar236;
        auVar202 = local_860;
        if ((((((((auVar179 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar179 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar179 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar179 >> 0x7f,0) != '\0') ||
              (auVar179 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar179 >> 0xbf,0) != '\0') ||
            (auVar179 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar179[0x1f] < '\0') {
          auVar202 = vandps_avx(auVar236,local_860);
        }
        uVar57 = vmovmskps_avx(auVar202);
        iVar15 = 0;
        for (; (uVar57 & 1) == 0; uVar57 = uVar57 >> 1 | 0x80000000) {
          iVar15 = iVar15 + 1;
        }
        uVar63 = (ulong)(uint)(iVar15 << 2);
        *(undefined4 *)(local_860 + uVar63) = 0;
        uVar57 = *(uint *)(local_1c0 + uVar63);
        uVar61 = *(uint *)(local_440 + uVar63);
        fVar97 = auVar6._0_4_;
        if ((float)local_960._0_4_ < 0.0) {
          auVar243 = ZEXT1664(auVar243._0_16_);
          fVar97 = sqrtf((float)local_960._0_4_);
          auVar271 = ZEXT3264(local_9a0);
          uVar63 = extraout_RAX_03;
        }
        auVar132 = vminps_avx(auVar8,auVar72);
        auVar79 = vmaxps_avx(auVar8,auVar72);
        auVar99 = vminps_avx(auVar73,auVar7);
        auVar71 = vminps_avx(auVar132,auVar99);
        auVar132 = vmaxps_avx(auVar73,auVar7);
        auVar99 = vmaxps_avx(auVar79,auVar132);
        auVar79 = vandps_avx(auVar71,auVar226);
        auVar132 = vandps_avx(auVar99,auVar226);
        auVar79 = vmaxps_avx(auVar79,auVar132);
        auVar132 = vmovshdup_avx(auVar79);
        auVar132 = vmaxss_avx(auVar132,auVar79);
        auVar79 = vshufpd_avx(auVar79,auVar79,1);
        auVar79 = vmaxss_avx(auVar79,auVar132);
        local_920._0_4_ = auVar79._0_4_ * 1.9073486e-06;
        local_9c0._0_4_ = fVar97 * 1.9073486e-06;
        local_7a0._0_16_ = vshufps_avx(auVar99,auVar99,0xff);
        auVar79 = vinsertps_avx(ZEXT416(uVar61),ZEXT416(uVar57),0x10);
        for (uVar65 = 0; bVar67 = (byte)uVar63, uVar65 != 5; uVar65 = uVar65 + 1) {
          auVar99 = vmovshdup_avx(auVar79);
          fVar131 = 1.0 - auVar99._0_4_;
          auVar132 = vshufps_avx(auVar79,auVar79,0x55);
          fVar97 = auVar132._0_4_;
          auVar108._0_4_ = fVar94 * fVar97;
          fVar126 = auVar132._4_4_;
          auVar108._4_4_ = auVar72._4_4_ * fVar126;
          fVar127 = auVar132._8_4_;
          auVar108._8_4_ = auVar72._8_4_ * fVar127;
          fVar128 = auVar132._12_4_;
          auVar108._12_4_ = auVar72._12_4_ * fVar128;
          auVar139._4_4_ = fVar131;
          auVar139._0_4_ = fVar131;
          auVar139._8_4_ = fVar131;
          auVar139._12_4_ = fVar131;
          auVar132 = vfmadd231ps_fma(auVar108,auVar139,auVar8);
          auVar159._0_4_ = fVar96 * fVar97;
          auVar159._4_4_ = auVar73._4_4_ * fVar126;
          auVar159._8_4_ = auVar73._8_4_ * fVar127;
          auVar159._12_4_ = auVar73._12_4_ * fVar128;
          auVar71 = vfmadd231ps_fma(auVar159,auVar139,auVar72);
          auVar189._0_4_ = fVar97 * auVar71._0_4_;
          auVar189._4_4_ = fVar126 * auVar71._4_4_;
          auVar189._8_4_ = fVar127 * auVar71._8_4_;
          auVar189._12_4_ = fVar128 * auVar71._12_4_;
          auVar100 = vfmadd231ps_fma(auVar189,auVar139,auVar132);
          auVar109._0_4_ = fVar97 * fVar95;
          auVar109._4_4_ = fVar126 * fStack_adc;
          auVar109._8_4_ = fVar127 * fStack_ad8;
          auVar109._12_4_ = fVar128 * fStack_ad4;
          auVar132 = vfmadd231ps_fma(auVar109,auVar139,auVar73);
          auVar176._0_4_ = fVar97 * auVar132._0_4_;
          auVar176._4_4_ = fVar126 * auVar132._4_4_;
          auVar176._8_4_ = fVar127 * auVar132._8_4_;
          auVar176._12_4_ = fVar128 * auVar132._12_4_;
          auVar153 = vfmadd231ps_fma(auVar176,auVar139,auVar71);
          fVar129 = auVar79._0_4_;
          auVar110._4_4_ = fVar129;
          auVar110._0_4_ = fVar129;
          auVar110._8_4_ = fVar129;
          auVar110._12_4_ = fVar129;
          auVar132 = vfmadd213ps_fma(auVar110,local_950,_DAT_01f45a50);
          auVar80._0_4_ = fVar97 * auVar153._0_4_;
          auVar80._4_4_ = fVar126 * auVar153._4_4_;
          auVar80._8_4_ = fVar127 * auVar153._8_4_;
          auVar80._12_4_ = fVar128 * auVar153._12_4_;
          auVar71 = vfmadd231ps_fma(auVar80,auVar100,auVar139);
          local_8e0._0_16_ = auVar71;
          auVar71 = vsubps_avx(auVar132,auVar71);
          auVar132 = vdpps_avx(auVar71,auVar71,0x7f);
          fVar97 = auVar132._0_4_;
          if (fVar97 < 0.0) {
            local_980._0_16_ = auVar100;
            auVar250._0_4_ = sqrtf(fVar97);
            auVar250._4_60_ = extraout_var_00;
            auVar76 = auVar250._0_16_;
            uVar63 = extraout_RAX_04;
            auVar100 = local_980._0_16_;
          }
          else {
            auVar76 = vsqrtss_avx(auVar132,auVar132);
          }
          auVar100 = vsubps_avx(auVar153,auVar100);
          auVar215._0_4_ = auVar100._0_4_ * 3.0;
          auVar215._4_4_ = auVar100._4_4_ * 3.0;
          auVar215._8_4_ = auVar100._8_4_ * 3.0;
          auVar215._12_4_ = auVar100._12_4_ * 3.0;
          auVar100 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),ZEXT416((uint)fVar131),auVar99);
          auVar153 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar99,ZEXT416((uint)fVar131));
          fVar131 = fVar131 * 6.0;
          fVar126 = auVar100._0_4_ * 6.0;
          fVar127 = auVar153._0_4_ * 6.0;
          fVar128 = auVar99._0_4_ * 6.0;
          auVar160._0_4_ = fVar128 * fVar95;
          auVar160._4_4_ = fVar128 * fStack_adc;
          auVar160._8_4_ = fVar128 * fStack_ad8;
          auVar160._12_4_ = fVar128 * fStack_ad4;
          auVar111._4_4_ = fVar127;
          auVar111._0_4_ = fVar127;
          auVar111._8_4_ = fVar127;
          auVar111._12_4_ = fVar127;
          auVar99 = vfmadd132ps_fma(auVar111,auVar160,auVar73);
          auVar161._4_4_ = fVar126;
          auVar161._0_4_ = fVar126;
          auVar161._8_4_ = fVar126;
          auVar161._12_4_ = fVar126;
          auVar99 = vfmadd132ps_fma(auVar161,auVar99,auVar72);
          auVar100 = vdpps_avx(auVar215,auVar215,0x7f);
          auVar112._4_4_ = fVar131;
          auVar112._0_4_ = fVar131;
          auVar112._8_4_ = fVar131;
          auVar112._12_4_ = fVar131;
          auVar70 = vfmadd132ps_fma(auVar112,auVar99,auVar8);
          auVar99 = vblendps_avx(auVar100,_DAT_01f45a50,0xe);
          auVar153 = vrsqrtss_avx(auVar99,auVar99);
          fVar128 = auVar100._0_4_;
          fVar126 = auVar153._0_4_;
          auVar153 = vdpps_avx(auVar215,auVar70,0x7f);
          fVar126 = fVar126 * 1.5 + fVar128 * -0.5 * fVar126 * fVar126 * fVar126;
          auVar113._0_4_ = auVar70._0_4_ * fVar128;
          auVar113._4_4_ = auVar70._4_4_ * fVar128;
          auVar113._8_4_ = auVar70._8_4_ * fVar128;
          auVar113._12_4_ = auVar70._12_4_ * fVar128;
          fVar127 = auVar153._0_4_;
          auVar190._0_4_ = auVar215._0_4_ * fVar127;
          auVar190._4_4_ = auVar215._4_4_ * fVar127;
          auVar190._8_4_ = auVar215._8_4_ * fVar127;
          auVar190._12_4_ = auVar215._12_4_ * fVar127;
          auVar153 = vsubps_avx(auVar113,auVar190);
          auVar99 = vrcpss_avx(auVar99,auVar99);
          auVar70 = vfnmadd213ss_fma(auVar99,auVar100,ZEXT416(0x40000000));
          fVar127 = auVar99._0_4_ * auVar70._0_4_;
          auVar99 = vmaxss_avx(ZEXT416((uint)local_920._0_4_),
                               ZEXT416((uint)(fVar129 * (float)local_9c0._0_4_)));
          auVar243 = ZEXT1664(auVar99);
          uVar50 = CONCAT44(auVar215._4_4_,auVar215._0_4_);
          auVar235._0_8_ = uVar50 ^ 0x8000000080000000;
          auVar235._8_4_ = -auVar215._8_4_;
          auVar235._12_4_ = -auVar215._12_4_;
          auVar162._0_4_ = fVar126 * auVar153._0_4_ * fVar127;
          auVar162._4_4_ = fVar126 * auVar153._4_4_ * fVar127;
          auVar162._8_4_ = fVar126 * auVar153._8_4_ * fVar127;
          auVar162._12_4_ = fVar126 * auVar153._12_4_ * fVar127;
          auVar201._0_4_ = auVar215._0_4_ * fVar126;
          auVar201._4_4_ = auVar215._4_4_ * fVar126;
          auVar201._8_4_ = auVar215._8_4_ * fVar126;
          auVar201._12_4_ = auVar215._12_4_ * fVar126;
          if (fVar128 < -fVar128) {
            local_980._0_4_ = auVar76._0_4_;
            local_9e0._0_16_ = auVar201;
            local_a00._0_16_ = auVar162;
            fVar126 = sqrtf(fVar128);
            auVar76 = ZEXT416((uint)local_980._0_4_);
            auVar243 = ZEXT464(auVar99._0_4_);
            uVar63 = extraout_RAX_05;
            auVar162 = local_a00._0_16_;
            auVar201 = local_9e0._0_16_;
          }
          else {
            auVar100 = vsqrtss_avx(auVar100,auVar100);
            fVar126 = auVar100._0_4_;
          }
          auVar100 = vdpps_avx(auVar71,auVar201,0x7f);
          auVar172 = vfmadd213ss_fma(ZEXT416((uint)local_920._0_4_),auVar76,auVar243._0_16_);
          auVar153 = vdpps_avx(auVar235,auVar201,0x7f);
          auVar70 = vdpps_avx(auVar71,auVar162,0x7f);
          auVar98 = vdpps_avx(local_950,auVar201,0x7f);
          auVar184 = vfmadd213ss_fma(ZEXT416((uint)(auVar76._0_4_ + 1.0)),
                                     ZEXT416((uint)((float)local_920._0_4_ / fVar126)),auVar172);
          fVar127 = auVar100._0_4_;
          auVar81._0_4_ = fVar127 * fVar127;
          auVar81._4_4_ = auVar100._4_4_ * auVar100._4_4_;
          auVar81._8_4_ = auVar100._8_4_ * auVar100._8_4_;
          auVar81._12_4_ = auVar100._12_4_ * auVar100._12_4_;
          auVar76 = vdpps_avx(auVar71,auVar235,0x7f);
          auVar134 = vsubps_avx(auVar132,auVar81);
          auVar172 = vrsqrtss_avx(auVar134,auVar134);
          fVar128 = auVar134._0_4_;
          fVar126 = auVar172._0_4_;
          fVar126 = fVar126 * 1.5 + fVar128 * -0.5 * fVar126 * fVar126 * fVar126;
          auVar172 = vdpps_avx(auVar71,local_950,0x7f);
          local_980._0_16_ = ZEXT416((uint)(auVar153._0_4_ + auVar70._0_4_));
          auVar153 = vfnmadd231ss_fma(auVar76,auVar100,local_980._0_16_);
          auVar76 = vfnmadd231ss_fma(auVar172,auVar100,auVar98);
          if (fVar128 < 0.0) {
            local_9e0._0_4_ = auVar184._0_4_;
            local_a00._0_16_ = auVar98;
            local_740._0_16_ = auVar153;
            local_760._0_4_ = fVar126;
            local_780._0_16_ = auVar76;
            fVar128 = sqrtf(fVar128);
            auVar243 = ZEXT464(auVar99._0_4_);
            uVar63 = extraout_RAX_06;
            fVar126 = (float)local_760._0_4_;
            auVar76 = local_780._0_16_;
            auVar98 = local_a00._0_16_;
            auVar153 = local_740._0_16_;
            fVar131 = (float)local_9e0._0_4_;
          }
          else {
            auVar99 = vsqrtss_avx(auVar134,auVar134);
            fVar128 = auVar99._0_4_;
            fVar131 = auVar184._0_4_;
          }
          auVar271 = ZEXT3264(local_9a0);
          auVar99 = vpermilps_avx(local_8e0._0_16_,0xff);
          fVar128 = fVar128 - auVar99._0_4_;
          auVar70 = vshufps_avx(auVar215,auVar215,0xff);
          auVar99 = vfmsub213ss_fma(auVar153,ZEXT416((uint)fVar126),auVar70);
          auVar163._0_8_ = auVar98._0_8_ ^ 0x8000000080000000;
          auVar163._8_4_ = auVar98._8_4_ ^ 0x80000000;
          auVar163._12_4_ = auVar98._12_4_ ^ 0x80000000;
          auVar177._0_8_ = auVar99._0_8_ ^ 0x8000000080000000;
          auVar177._8_4_ = auVar99._8_4_ ^ 0x80000000;
          auVar177._12_4_ = auVar99._12_4_ ^ 0x80000000;
          auVar76 = ZEXT416((uint)(auVar76._0_4_ * fVar126));
          auVar153 = vfmsub231ss_fma(ZEXT416((uint)(auVar99._0_4_ * auVar98._0_4_)),local_980._0_16_
                                     ,auVar76);
          auVar99 = vinsertps_avx(auVar177,auVar76,0x1c);
          uVar64 = auVar153._0_4_;
          auVar178._4_4_ = uVar64;
          auVar178._0_4_ = uVar64;
          auVar178._8_4_ = uVar64;
          auVar178._12_4_ = uVar64;
          auVar99 = vdivps_avx(auVar99,auVar178);
          auVar153 = vinsertps_avx(local_980._0_16_,auVar163,0x10);
          auVar153 = vdivps_avx(auVar153,auVar178);
          auVar140._0_4_ = fVar127 * auVar99._0_4_ + fVar128 * auVar153._0_4_;
          auVar140._4_4_ = fVar127 * auVar99._4_4_ + fVar128 * auVar153._4_4_;
          auVar140._8_4_ = fVar127 * auVar99._8_4_ + fVar128 * auVar153._8_4_;
          auVar140._12_4_ = fVar127 * auVar99._12_4_ + fVar128 * auVar153._12_4_;
          auVar79 = vsubps_avx(auVar79,auVar140);
          auVar99 = vandps_avx(auVar100,auVar226);
          if (auVar99._0_4_ < fVar131) {
            auVar100 = vfmadd231ss_fma(ZEXT416((uint)(auVar243._0_4_ + fVar131)),local_7a0._0_16_,
                                       ZEXT416(0x36000000));
            auVar99 = vandps_avx(ZEXT416((uint)fVar128),auVar226);
            if (auVar99._0_4_ < auVar100._0_4_) {
              bVar66 = uVar65 < 5;
              fVar126 = auVar79._0_4_ + (float)local_8c0._0_4_;
              if ((fVar68 <= fVar126) &&
                 (fVar127 = *(float *)(ray + k * 4 + 0x80), fVar126 <= fVar127)) {
                auVar99 = vmovshdup_avx(auVar79);
                bVar67 = 0;
                if ((auVar99._0_4_ < 0.0) || (1.0 < auVar99._0_4_)) goto LAB_01197253;
                auVar132 = vrsqrtss_avx(auVar132,auVar132);
                fVar128 = auVar132._0_4_;
                pGVar2 = (context->scene->geometries).items[uVar58].ptr;
                if ((pGVar2->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (bVar67 = 1, pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    fVar97 = fVar128 * 1.5 + fVar97 * -0.5 * fVar128 * fVar128 * fVar128;
                    local_aa0 = auVar71._0_4_;
                    fStack_a9c = auVar71._4_4_;
                    fStack_a98 = auVar71._8_4_;
                    fStack_a94 = auVar71._12_4_;
                    auVar141._0_4_ = fVar97 * local_aa0;
                    auVar141._4_4_ = fVar97 * fStack_a9c;
                    auVar141._8_4_ = fVar97 * fStack_a98;
                    auVar141._12_4_ = fVar97 * fStack_a94;
                    auVar100 = vfmadd213ps_fma(auVar70,auVar141,auVar215);
                    auVar132 = vshufps_avx(auVar141,auVar141,0xc9);
                    auVar99 = vshufps_avx(auVar215,auVar215,0xc9);
                    auVar142._0_4_ = auVar141._0_4_ * auVar99._0_4_;
                    auVar142._4_4_ = auVar141._4_4_ * auVar99._4_4_;
                    auVar142._8_4_ = auVar141._8_4_ * auVar99._8_4_;
                    auVar142._12_4_ = auVar141._12_4_ * auVar99._12_4_;
                    auVar71 = vfmsub231ps_fma(auVar142,auVar215,auVar132);
                    auVar132 = vshufps_avx(auVar71,auVar71,0xc9);
                    auVar99 = vshufps_avx(auVar100,auVar100,0xc9);
                    auVar71 = vshufps_avx(auVar71,auVar71,0xd2);
                    auVar82._0_4_ = auVar100._0_4_ * auVar71._0_4_;
                    auVar82._4_4_ = auVar100._4_4_ * auVar71._4_4_;
                    auVar82._8_4_ = auVar100._8_4_ * auVar71._8_4_;
                    auVar82._12_4_ = auVar100._12_4_ * auVar71._12_4_;
                    auVar132 = vfmsub231ps_fma(auVar82,auVar132,auVar99);
                    local_6d0 = vshufps_avx(auVar79,auVar79,0x55);
                    local_700 = (RTCHitN  [16])vshufps_avx(auVar132,auVar132,0x55);
                    auStack_6f0 = vshufps_avx(auVar132,auVar132,0xaa);
                    local_6e0 = auVar132._0_4_;
                    local_6c0 = ZEXT416(0) << 0x20;
                    local_6b0 = CONCAT44(uStack_71c,local_720);
                    uStack_6a8 = CONCAT44(uStack_714,uStack_718);
                    local_6a0._4_4_ = uStack_70c;
                    local_6a0._0_4_ = local_710;
                    local_6a0._8_4_ = uStack_708;
                    local_6a0._12_4_ = uStack_704;
                    vpcmpeqd_avx2(ZEXT1632(local_6a0),ZEXT1632(local_6a0));
                    uStack_68c = context->user->instID[0];
                    local_690 = uStack_68c;
                    uStack_688 = uStack_68c;
                    uStack_684 = uStack_68c;
                    uStack_680 = context->user->instPrimID[0];
                    uStack_67c = uStack_680;
                    uStack_678 = uStack_680;
                    uStack_674 = uStack_680;
                    *(float *)(ray + k * 4 + 0x80) = fVar126;
                    local_8b0 = *(undefined1 (*) [16])
                                 (mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
                    local_a50.valid = (int *)local_8b0;
                    local_a50.geometryUserPtr = pGVar2->userPtr;
                    local_a50.context = context->user;
                    local_a50.hit = local_700;
                    local_a50.N = 4;
                    local_a50.ray = (RTCRayN *)ray;
                    uStack_6dc = local_6e0;
                    uStack_6d8 = local_6e0;
                    uStack_6d4 = local_6e0;
                    if (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar243 = ZEXT1664(auVar243._0_16_);
                      (*pGVar2->occlusionFilterN)(&local_a50);
                      auVar271 = ZEXT3264(local_9a0);
                    }
                    if (local_8b0 == (undefined1  [16])0x0) {
                      auVar79 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                      auVar79 = auVar79 ^ _DAT_01f46b70;
                    }
                    else {
                      p_Var3 = context->args->filter;
                      if ((p_Var3 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar2->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar243 = ZEXT1664(auVar243._0_16_);
                        (*p_Var3)(&local_a50);
                        auVar271 = ZEXT3264(local_9a0);
                      }
                      auVar132 = vpcmpeqd_avx(local_8b0,_DAT_01f45a50);
                      auVar79 = auVar132 ^ _DAT_01f46b70;
                      auVar143._8_4_ = 0xff800000;
                      auVar143._0_8_ = 0xff800000ff800000;
                      auVar143._12_4_ = 0xff800000;
                      auVar132 = vblendvps_avx(auVar143,*(undefined1 (*) [16])(local_a50.ray + 0x80)
                                               ,auVar132);
                      *(undefined1 (*) [16])(local_a50.ray + 0x80) = auVar132;
                    }
                    auVar114._8_8_ = 0x100000001;
                    auVar114._0_8_ = 0x100000001;
                    bVar67 = (auVar114 & auVar79) != (undefined1  [16])0x0;
                    if (!(bool)bVar67) {
                      *(float *)(ray + k * 4 + 0x80) = fVar127;
                    }
                  }
                  goto LAB_01197253;
                }
              }
              bVar67 = 0;
              goto LAB_01197253;
            }
          }
        }
        bVar66 = false;
LAB_01197253:
        uVar64 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar232._4_4_ = uVar64;
        auVar232._0_4_ = uVar64;
        auVar232._8_4_ = uVar64;
        auVar232._12_4_ = uVar64;
        auVar232._16_4_ = uVar64;
        auVar232._20_4_ = uVar64;
        auVar232._24_4_ = uVar64;
        auVar232._28_4_ = uVar64;
        auVar233 = ZEXT3264(auVar232);
        bVar62 = bVar62 | bVar66 & bVar67;
        auVar202 = vcmpps_avx(_local_a20,auVar232,2);
      }
      auVar124._0_4_ = (float)local_880._0_4_ + local_4a0._0_4_;
      auVar124._4_4_ = (float)local_880._4_4_ + local_4a0._4_4_;
      auVar124._8_4_ = fStack_878 + local_4a0._8_4_;
      auVar124._12_4_ = fStack_874 + local_4a0._12_4_;
      auVar124._16_4_ = fStack_870 + local_4a0._16_4_;
      auVar124._20_4_ = fStack_86c + local_4a0._20_4_;
      auVar124._24_4_ = fStack_868 + local_4a0._24_4_;
      auVar124._28_4_ = fStack_864 + local_4a0._28_4_;
      uVar64 = auVar233._0_4_;
      auVar170._4_4_ = uVar64;
      auVar170._0_4_ = uVar64;
      auVar170._8_4_ = uVar64;
      auVar170._12_4_ = uVar64;
      auVar170._16_4_ = uVar64;
      auVar170._20_4_ = uVar64;
      auVar170._24_4_ = uVar64;
      auVar170._28_4_ = uVar64;
      auVar202 = vcmpps_avx(auVar124,auVar170,2);
      auVar84 = vandps_avx(local_5e0,local_5c0);
      auVar84 = vandps_avx(auVar202,auVar84);
      auVar183._0_4_ = (float)local_880._0_4_ + local_460._0_4_;
      auVar183._4_4_ = (float)local_880._4_4_ + local_460._4_4_;
      auVar183._8_4_ = fStack_878 + local_460._8_4_;
      auVar183._12_4_ = fStack_874 + local_460._12_4_;
      auVar183._16_4_ = fStack_870 + local_460._16_4_;
      auVar183._20_4_ = fStack_86c + local_460._20_4_;
      auVar183._24_4_ = fStack_868 + local_460._24_4_;
      auVar183._28_4_ = fStack_864 + local_460._28_4_;
      auVar236 = vcmpps_avx(auVar183,auVar170,2);
      auVar202 = vandps_avx(_local_840,_local_820);
      auVar202 = vandps_avx(auVar236,auVar202);
      auVar202 = vorps_avx(auVar84,auVar202);
      if ((((((((auVar202 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar202 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar202 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar202 >> 0x7f,0) != '\0') ||
            (auVar202 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar202 >> 0xbf,0) != '\0') ||
          (auVar202 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar202[0x1f] < '\0') {
        *(undefined1 (*) [32])(auStack_180 + uVar59 * 0x60) = auVar202;
        auVar84 = vblendvps_avx(_local_460,local_4a0,auVar84);
        *(undefined1 (*) [32])(auStack_160 + uVar59 * 0x60) = auVar84;
        uVar63 = vmovlps_avx(local_590);
        (&uStack_140)[uVar59 * 0xc] = uVar63;
        aiStack_138[uVar59 * 0x18] = local_c04 + 1;
        uVar59 = (ulong)((int)uVar59 + 1);
      }
      auVar250 = ZEXT3264(CONCAT824(uStack_928,CONCAT816(uStack_930,CONCAT88(uStack_938,local_940)))
                         );
      auVar260 = ZEXT3264(local_900);
      fVar97 = (float)local_880._0_4_;
      fVar126 = (float)local_880._4_4_;
      fVar127 = fStack_878;
      fVar128 = fStack_874;
      fVar131 = fStack_870;
      fVar129 = fStack_86c;
      fVar130 = fStack_868;
      fVar197 = fStack_864;
    }
    while( true ) {
      auVar179 = local_540;
      auVar202 = local_560;
      uVar57 = (uint)uVar59;
      if (uVar57 == 0) {
        if (bVar62 != 0) goto LAB_01197756;
        uVar64 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar83._4_4_ = uVar64;
        auVar83._0_4_ = uVar64;
        auVar83._8_4_ = uVar64;
        auVar83._12_4_ = uVar64;
        auVar4 = vcmpps_avx(local_5a0,auVar83,2);
        uVar58 = vmovmskps_avx(auVar4);
        local_888 = (ulong)((uint)local_890 & uVar58);
        goto LAB_0119509d;
      }
      uVar59 = (ulong)(uVar57 - 1);
      lVar60 = uVar59 * 0x60;
      auVar84 = *(undefined1 (*) [32])(auStack_160 + lVar60);
      auVar89._0_4_ = fVar97 + auVar84._0_4_;
      auVar89._4_4_ = fVar126 + auVar84._4_4_;
      auVar89._8_4_ = fVar127 + auVar84._8_4_;
      auVar89._12_4_ = fVar128 + auVar84._12_4_;
      auVar89._16_4_ = fVar131 + auVar84._16_4_;
      auVar89._20_4_ = fVar129 + auVar84._20_4_;
      auVar89._24_4_ = fVar130 + auVar84._24_4_;
      auVar89._28_4_ = fVar197 + auVar84._28_4_;
      uVar64 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar169._4_4_ = uVar64;
      auVar169._0_4_ = uVar64;
      auVar169._8_4_ = uVar64;
      auVar169._12_4_ = uVar64;
      auVar169._16_4_ = uVar64;
      auVar169._20_4_ = uVar64;
      auVar169._24_4_ = uVar64;
      auVar169._28_4_ = uVar64;
      auVar236 = vcmpps_avx(auVar89,auVar169,2);
      _local_700 = vandps_avx(auVar236,*(undefined1 (*) [32])(auStack_180 + lVar60));
      auVar236 = *(undefined1 (*) [32])(auStack_180 + lVar60) & auVar236;
      if ((((((((auVar236 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar236 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar236 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar236 >> 0x7f,0) != '\0') ||
            (auVar236 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar236 >> 0xbf,0) != '\0') ||
          (auVar236 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar236[0x1f] < '\0') break;
      uVar59 = (ulong)(uVar57 - 1);
    }
    auVar145._8_4_ = 0x7f800000;
    auVar145._0_8_ = 0x7f8000007f800000;
    auVar145._12_4_ = 0x7f800000;
    auVar145._16_4_ = 0x7f800000;
    auVar145._20_4_ = 0x7f800000;
    auVar145._24_4_ = 0x7f800000;
    auVar145._28_4_ = 0x7f800000;
    auVar84 = vblendvps_avx(auVar145,auVar84,_local_700);
    auVar236 = vshufps_avx(auVar84,auVar84,0xb1);
    auVar236 = vminps_avx(auVar84,auVar236);
    auVar10 = vshufpd_avx(auVar236,auVar236,5);
    auVar236 = vminps_avx(auVar236,auVar10);
    auVar10 = vpermpd_avx2(auVar236,0x4e);
    auVar236 = vminps_avx(auVar236,auVar10);
    auVar236 = vcmpps_avx(auVar84,auVar236,0);
    auVar10 = _local_700 & auVar236;
    auVar84 = _local_700;
    if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar10 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar10 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar10 >> 0x7f,0) != '\0') ||
          (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar10 >> 0xbf,0) != '\0') ||
        (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar10[0x1f] < '\0')
    {
      auVar84 = vandps_avx(auVar236,_local_700);
    }
    auVar225 = ZEXT3264(local_560);
    uVar61 = vmovmskps_avx(auVar84);
    iVar15 = 0;
    for (; (uVar61 & 1) == 0; uVar61 = uVar61 >> 1 | 0x80000000) {
      iVar15 = iVar15 + 1;
    }
    *(undefined4 *)(local_700 + (uint)(iVar15 << 2)) = 0;
    uVar63 = (&uStack_140)[uVar59 * 0xc];
    auVar74._8_8_ = 0;
    auVar74._0_8_ = uVar63;
    local_c04 = aiStack_138[uVar59 * 0x18];
    *(undefined1 (*) [32])(auStack_180 + lVar60) = _local_700;
    uVar61 = uVar57 - 1;
    if ((((((((_local_700 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (_local_700 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (_local_700 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(_local_700 >> 0x7f,0) != '\0') ||
          (_local_700 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(_local_700 >> 0xbf,0) != '\0') ||
        (_local_700 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_700[0x1f] < '\0') {
      uVar61 = uVar57;
    }
    uVar64 = (undefined4)uVar63;
    auVar118._4_4_ = uVar64;
    auVar118._0_4_ = uVar64;
    auVar118._8_4_ = uVar64;
    auVar118._12_4_ = uVar64;
    auVar118._16_4_ = uVar64;
    auVar118._20_4_ = uVar64;
    auVar118._24_4_ = uVar64;
    auVar118._28_4_ = uVar64;
    auVar79 = vmovshdup_avx(auVar74);
    auVar79 = vsubps_avx(auVar79,auVar74);
    auVar90._0_4_ = auVar79._0_4_;
    auVar90._4_4_ = auVar90._0_4_;
    auVar90._8_4_ = auVar90._0_4_;
    auVar90._12_4_ = auVar90._0_4_;
    auVar90._16_4_ = auVar90._0_4_;
    auVar90._20_4_ = auVar90._0_4_;
    auVar90._24_4_ = auVar90._0_4_;
    auVar90._28_4_ = auVar90._0_4_;
    auVar79 = vfmadd132ps_fma(auVar90,auVar118,_DAT_01f7b040);
    local_4a0 = ZEXT1632(auVar79);
    local_590._8_8_ = 0;
    local_590._0_8_ = *(ulong *)(local_4a0 + (uint)(iVar15 << 2));
    uVar59 = (ulong)uVar61;
    auVar236 = auVar271._0_32_;
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }